

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void stats_arena_print(emitter_t *emitter,uint i,_Bool bins,_Bool large,_Bool mutex,_Bool extents,
                      _Bool hpa)

{
  anon_union_8_10_2a69db89_for_emitter_col_s_3 *paVar1;
  bool bVar2;
  bool bVar3;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar4;
  uint64_t uVar5;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  tsd_t *ptVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  tsd_t *ptVar15;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  long lVar16;
  emitter_type_t eVar17;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  byte bVar18;
  pszind_t j;
  emitter_t *peVar19;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar20;
  char *pcVar21;
  emitter_col_t *peVar22;
  emitter_col_t *peVar23;
  emitter_row_t eVar24;
  char *pcVar25;
  emitter_col_t *peVar26;
  size_t sz_1;
  emitter_type_t local_9e8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_9e0;
  emitter_col_t *local_9d8;
  emitter_col_t *local_9d0;
  size_t miblen;
  emitter_type_t local_9c0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_9b8;
  emitter_col_t *local_9b0;
  emitter_col_t *local_9a8;
  uint64_t uptime;
  size_t miblen_new_9;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_978;
  size_t ndirty_nonhuge;
  uint64_t uptime_s;
  size_t nactive_nonhuge;
  size_t sz_63;
  size_t npageslabs_nonhuge;
  size_t npageslabs_huge;
  emitter_t *local_940;
  size_t ndirty_huge;
  size_t nactive_huge;
  undefined4 local_924;
  size_t miblen_new;
  emitter_type_t local_918;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_910;
  emitter_col_t *local_908;
  emitter_col_t *local_900;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_8f8;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  uint nthreads;
  size_t sz_40;
  emitter_type_t local_8d8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_8d0;
  emitter_col_t *local_8c8;
  emitter_col_t *local_8c0;
  emitter_col_t mem_count_val;
  uint64_t large_nflushes;
  uint64_t large_nfills;
  uint64_t large_nrequests;
  uint64_t large_ndalloc;
  uint64_t large_nmalloc;
  size_t large_allocated;
  uint64_t small_nflushes;
  uint64_t small_nfills;
  uint64_t small_nrequests;
  uint64_t small_ndalloc;
  uint64_t small_nmalloc;
  size_t small_allocated;
  uint64_t muzzy_purged;
  uint64_t muzzy_nmadvise;
  uint64_t muzzy_npurge;
  uint64_t dirty_purged;
  uint64_t dirty_nmadvise;
  uint64_t dirty_npurge;
  size_t pmuzzy;
  size_t pdirty;
  size_t pactive;
  ssize_t muzzy_decay_ms;
  ssize_t dirty_decay_ms;
  char *namep;
  uint64_t ndehugifies;
  uint64_t nhugifies;
  uint64_t npurges;
  uint64_t npurge_passes;
  emitter_col_t mem_count_title;
  size_t sz;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_780;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_778 [3];
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_760;
  undefined4 local_758;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_750;
  undefined4 local_730;
  ulong local_728 [4];
  undefined4 local_708;
  ulong local_700;
  undefined4 local_6e0;
  ulong local_6d8 [4];
  undefined4 local_6b8;
  ulong local_6b0;
  undefined4 local_690;
  ulong local_688 [4];
  undefined4 local_668;
  ulong local_660;
  undefined4 local_640;
  ulong local_638 [4];
  undefined4 local_618;
  ulong local_610;
  undefined4 local_5f0;
  undefined1 local_5e8 [32];
  emitter_col_t col_count_nflushes;
  emitter_col_t col_count_nfills;
  emitter_col_t col_count_nrequests;
  emitter_col_t col_count_ndalloc;
  emitter_col_t col_count_nmalloc;
  emitter_col_t col_count_nflushes_ps;
  emitter_col_t col_count_nfills_ps;
  emitter_col_t col_count_nrequests_ps;
  emitter_col_t col_count_ndalloc_ps;
  emitter_col_t col_count_nmalloc_ps;
  emitter_col_t col_decay_purged;
  emitter_col_t col_decay_madvises;
  emitter_col_t col_decay_sweeps;
  emitter_col_t col_decay_npages;
  size_t abandoned_vm;
  size_t tcache_stashed_bytes;
  size_t tcache_bytes;
  size_t extent_avail;
  size_t metadata_thp;
  size_t metadata_rtree;
  size_t metadata_edata;
  size_t resident;
  size_t internal;
  size_t base;
  size_t retained;
  size_t mapped;
  size_t page;
  char *dss;
  size_t sec_bytes;
  emitter_col_t header_nretained_nonhuge;
  emitter_col_t col_nretained_nonhuge;
  emitter_col_t header_ndirty_nonhuge;
  emitter_col_t col_ndirty_nonhuge;
  emitter_col_t header_nactive_nonhuge;
  emitter_col_t col_nactive_nonhuge;
  emitter_col_t header_npageslabs_nonhuge;
  emitter_col_t col_npageslabs_nonhuge;
  emitter_col_t header_ndirty_huge;
  emitter_col_t col_ndirty_huge;
  emitter_col_t local_190;
  emitter_col_t col32 [1];
  emitter_col_t col_count_allocated;
  emitter_row_t row;
  emitter_col_t col_count_title;
  emitter_col_t col_decay_type;
  emitter_col_t col_nactive_huge;
  char name [32];
  emitter_col_t header_nactive_huge;
  
  local_924 = (undefined4)CONCAT71(in_register_00000081,mutex);
  local_8e8 = (undefined4)CONCAT71(in_register_00000009,large);
  local_8ec = (undefined4)CONCAT71(in_register_00000011,bins);
  aVar20.uint64_val._4_4_ = 0;
  aVar20.unsigned_val = i;
  namep = name;
  sz = 8;
  iVar8 = duckdb_je_mallctl("arenas.page",&page,&sz,(void *)0x0,0);
  if (iVar8 != 0) {
    pcVar25 = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar21 = "arenas.page";
    goto LAB_00d07b1c;
  }
  if (i - 0x1002 < 0xfffffffe) {
    miblen = 7;
    sz_1 = 8;
    iVar8 = duckdb_je_mallctlnametomib("arena.0.name",&sz,&miblen);
    if (iVar8 != 0) {
      pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
      pcVar21 = "arena.0.name";
      goto LAB_00d07b1c;
    }
    local_780 = aVar20;
    iVar8 = duckdb_je_mallctlbymib(&sz,miblen,&namep,&sz_1,(void *)0x0,0);
    if (iVar8 == 0) {
      emitter_kv_note(emitter,"name","name",emitter_type_string,&namep,(char *)0x0,emitter_type_bool
                      ,(void *)0x0);
      goto LAB_00d02a4f;
    }
  }
  else {
LAB_00d02a4f:
    miblen = 7;
    sz_1 = 4;
    iVar8 = duckdb_je_mallctlnametomib("stats.arenas.0.nthreads",&sz,&miblen);
    if (iVar8 != 0) {
      pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
      pcVar21 = "stats.arenas.0.nthreads";
      goto LAB_00d07b1c;
    }
    local_778[0] = aVar20;
    iVar8 = duckdb_je_mallctlbymib(&sz,miblen,&nthreads,&sz_1,(void *)0x0,0);
    if (iVar8 == 0) {
      emitter_kv_note(emitter,"nthreads","assigned threads",emitter_type_unsigned,&nthreads,
                      (char *)0x0,emitter_type_bool,(void *)0x0);
      miblen = 7;
      sz_1 = 8;
      iVar8 = duckdb_je_mallctlnametomib("stats.arenas.0.uptime",&sz,&miblen);
      if (iVar8 != 0) {
        pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
        pcVar21 = "stats.arenas.0.uptime";
        goto LAB_00d07b1c;
      }
      local_778[0] = aVar20;
      iVar8 = duckdb_je_mallctlbymib(&sz,miblen,&uptime,&sz_1,(void *)0x0,0);
      if (iVar8 == 0) {
        emitter_kv_note(emitter,"uptime_ns","uptime",emitter_type_uint64,&uptime,(char *)0x0,
                        emitter_type_bool,(void *)0x0);
        miblen = 7;
        sz_1 = 8;
        iVar8 = duckdb_je_mallctlnametomib("stats.arenas.0.dss",&sz,&miblen);
        if (iVar8 != 0) {
          pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar21 = "stats.arenas.0.dss";
          goto LAB_00d07b1c;
        }
        local_778[0] = aVar20;
        iVar8 = duckdb_je_mallctlbymib(&sz,miblen,&dss,&sz_1,(void *)0x0,0);
        if (iVar8 == 0) {
          emitter_kv_note(emitter,"dss","dss allocation precedence",emitter_type_string,&dss,
                          (char *)0x0,emitter_type_bool,(void *)0x0);
          miblen = 7;
          sz_1 = 8;
          iVar8 = duckdb_je_mallctlnametomib("stats.arenas.0.dirty_decay_ms",&sz,&miblen);
          if (iVar8 != 0) {
            pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar21 = "stats.arenas.0.dirty_decay_ms";
            goto LAB_00d07b1c;
          }
          local_778[0] = aVar20;
          iVar8 = duckdb_je_mallctlbymib(&sz,miblen,&dirty_decay_ms,&sz_1,(void *)0x0,0);
          if (iVar8 == 0) {
            miblen = 7;
            sz_1 = 8;
            iVar8 = duckdb_je_mallctlnametomib("stats.arenas.0.muzzy_decay_ms",&sz,&miblen);
            if (iVar8 != 0) {
              pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
              pcVar21 = "stats.arenas.0.muzzy_decay_ms";
              goto LAB_00d07b1c;
            }
            local_778[0] = aVar20;
            iVar8 = duckdb_je_mallctlbymib(&sz,miblen,&muzzy_decay_ms,&sz_1,(void *)0x0,0);
            if (iVar8 == 0) {
              miblen = 7;
              sz_1 = 8;
              iVar8 = duckdb_je_mallctlnametomib("stats.arenas.0.pactive",&sz,&miblen);
              if (iVar8 != 0) {
                pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                pcVar21 = "stats.arenas.0.pactive";
                goto LAB_00d07b1c;
              }
              local_778[0] = aVar20;
              iVar8 = duckdb_je_mallctlbymib(&sz,miblen,&pactive,&sz_1,(void *)0x0,0);
              if (iVar8 == 0) {
                miblen = 7;
                sz_1 = 8;
                iVar8 = duckdb_je_mallctlnametomib("stats.arenas.0.pdirty",&sz,&miblen);
                if (iVar8 != 0) {
                  pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                  pcVar21 = "stats.arenas.0.pdirty";
                  goto LAB_00d07b1c;
                }
                local_778[0] = aVar20;
                iVar8 = duckdb_je_mallctlbymib(&sz,miblen,&pdirty,&sz_1,(void *)0x0,0);
                if (iVar8 == 0) {
                  miblen = 7;
                  sz_1 = 8;
                  iVar8 = duckdb_je_mallctlnametomib("stats.arenas.0.pmuzzy",&sz,&miblen);
                  if (iVar8 != 0) {
                    pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                    pcVar21 = "stats.arenas.0.pmuzzy";
                    goto LAB_00d07b1c;
                  }
                  local_778[0] = aVar20;
                  iVar8 = duckdb_je_mallctlbymib(&sz,miblen,&pmuzzy,&sz_1,(void *)0x0,0);
                  if (iVar8 == 0) {
                    miblen = 7;
                    sz_1 = 8;
                    iVar8 = duckdb_je_mallctlnametomib("stats.arenas.0.dirty_npurge",&sz,&miblen);
                    if (iVar8 != 0) {
                      pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                      pcVar21 = "stats.arenas.0.dirty_npurge";
                      goto LAB_00d07b1c;
                    }
                    local_778[0] = aVar20;
                    iVar8 = duckdb_je_mallctlbymib(&sz,miblen,&dirty_npurge,&sz_1,(void *)0x0,0);
                    if (iVar8 == 0) {
                      miblen = 7;
                      sz_1 = 8;
                      iVar8 = duckdb_je_mallctlnametomib
                                        ("stats.arenas.0.dirty_nmadvise",&sz,&miblen);
                      if (iVar8 != 0) {
                        pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                        pcVar21 = "stats.arenas.0.dirty_nmadvise";
                        goto LAB_00d07b1c;
                      }
                      local_778[0] = aVar20;
                      iVar8 = duckdb_je_mallctlbymib(&sz,miblen,&dirty_nmadvise,&sz_1,(void *)0x0,0)
                      ;
                      if (iVar8 == 0) {
                        miblen = 7;
                        sz_1 = 8;
                        iVar8 = duckdb_je_mallctlnametomib
                                          ("stats.arenas.0.dirty_purged",&sz,&miblen);
                        if (iVar8 != 0) {
                          pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                          pcVar21 = "stats.arenas.0.dirty_purged";
                          goto LAB_00d07b1c;
                        }
                        local_778[0] = aVar20;
                        iVar8 = duckdb_je_mallctlbymib(&sz,miblen,&dirty_purged,&sz_1,(void *)0x0,0)
                        ;
                        if (iVar8 == 0) {
                          miblen = 7;
                          sz_1 = 8;
                          iVar8 = duckdb_je_mallctlnametomib
                                            ("stats.arenas.0.muzzy_npurge",&sz,&miblen);
                          if (iVar8 != 0) {
                            pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                            pcVar21 = "stats.arenas.0.muzzy_npurge";
                            goto LAB_00d07b1c;
                          }
                          local_778[0] = aVar20;
                          iVar8 = duckdb_je_mallctlbymib
                                            (&sz,miblen,&muzzy_npurge,&sz_1,(void *)0x0,0);
                          if (iVar8 == 0) {
                            miblen = 7;
                            sz_1 = 8;
                            iVar8 = duckdb_je_mallctlnametomib
                                              ("stats.arenas.0.muzzy_nmadvise",&sz,&miblen);
                            if (iVar8 != 0) {
                              pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                              pcVar21 = "stats.arenas.0.muzzy_nmadvise";
                              goto LAB_00d07b1c;
                            }
                            local_778[0] = aVar20;
                            iVar8 = duckdb_je_mallctlbymib
                                              (&sz,miblen,&muzzy_nmadvise,&sz_1,(void *)0x0,0);
                            if (iVar8 == 0) {
                              miblen = 7;
                              sz_1 = 8;
                              iVar8 = duckdb_je_mallctlnametomib
                                                ("stats.arenas.0.muzzy_purged",&sz,&miblen);
                              if (iVar8 != 0) {
                                pcVar25 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                pcVar21 = "stats.arenas.0.muzzy_purged";
                                goto LAB_00d07b1c;
                              }
                              local_8f0 = (undefined4)CONCAT71(in_register_00000089,extents);
                              local_978 = aVar20;
                              local_8f8 = aVar20;
                              local_778[0] = aVar20;
                              iVar8 = duckdb_je_mallctlbymib
                                                (&sz,miblen,&muzzy_purged,&sz_1,(void *)0x0,0);
                              if (iVar8 == 0) {
                                emitter_json_kv(emitter,"dirty_decay_ms",emitter_type_ssize,
                                                &dirty_decay_ms);
                                emitter_json_kv(emitter,"muzzy_decay_ms",emitter_type_ssize,
                                                &muzzy_decay_ms);
                                emitter_json_kv(emitter,"pactive",emitter_type_size,&pactive);
                                emitter_json_kv(emitter,"pdirty",emitter_type_size,&pdirty);
                                emitter_json_kv(emitter,"pmuzzy",emitter_type_size,&pmuzzy);
                                eVar17 = emitter_type_uint64;
                                emitter_json_kv(emitter,"dirty_npurge",emitter_type_uint64,
                                                &dirty_npurge);
                                emitter_json_kv(emitter,"dirty_nmadvise",emitter_type_uint64,
                                                &dirty_nmadvise);
                                emitter_json_kv(emitter,"dirty_purged",emitter_type_uint64,
                                                &dirty_purged);
                                emitter_json_kv(emitter,"muzzy_npurge",emitter_type_uint64,
                                                &muzzy_npurge);
                                emitter_json_kv(emitter,"muzzy_nmadvise",emitter_type_uint64,
                                                &muzzy_nmadvise);
                                emitter_json_kv(emitter,"muzzy_purged",emitter_type_uint64,
                                                &muzzy_purged);
                                local_190.link.qre_next = &col_decay_type;
                                col_decay_type.justify = emitter_justify_right;
                                col_decay_type.width = 9;
                                local_190.type = emitter_type_title;
                                col_decay_type.field_3.str_val = "decaying:";
                                col_decay_type.link.qre_next = &local_190;
                                local_190.justify = emitter_justify_right;
                                local_190.width = 6;
                                local_190.field_3.str_val = "time";
                                peVar23 = &col_decay_npages;
                                col_decay_npages.link.qre_prev = &col_decay_npages;
                                col_decay_type.link.qre_prev = col_decay_type.link.qre_next;
                                if (local_190.link.qre_next != (emitter_col_t *)0x0) {
                                  col_decay_npages.link.qre_prev = col_decay_npages.link.qre_next;
                                  ((col_decay_npages.link.qre_next)->link).qre_next =
                                       &col_decay_npages;
                                  peVar23 = col_decay_type.link.qre_next;
                                  col_decay_type.link.qre_prev = &col_decay_npages;
                                }
                                col_decay_npages.link.qre_next = peVar23;
                                col_decay_npages.justify = emitter_justify_right;
                                col_decay_npages.width = 0xd;
                                col_decay_npages.type = emitter_type_title;
                                col_decay_npages.field_3.str_val = "npages";
                                col_decay_sweeps.link.qre_prev = &col_decay_sweeps;
                                local_190.link.qre_prev = local_190.link.qre_next;
                                col_decay_type.type = local_190.type;
                                if (col_decay_npages.link.qre_next != (emitter_col_t *)0x0) {
                                  col_decay_sweeps.link.qre_prev =
                                       ((col_decay_npages.link.qre_next)->link).qre_prev;
                                  ((col_decay_npages.link.qre_next)->link).qre_prev =
                                       &col_decay_sweeps;
                                  ((((col_decay_npages.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_decay_npages.link.qre_next;
                                  ((col_decay_sweeps.link.qre_prev)->link).qre_next =
                                       &col_decay_sweeps;
                                }
                                col_decay_sweeps.link.qre_next = col_decay_sweeps.link.qre_prev;
                                col_decay_sweeps.justify = emitter_justify_right;
                                col_decay_sweeps.width = 0xd;
                                col_decay_sweeps.type = emitter_type_title;
                                col_decay_sweeps.field_3.str_val = "sweeps";
                                col_decay_madvises.link.qre_prev = &col_decay_madvises;
                                if (col_decay_sweeps.link.qre_prev != (emitter_col_t *)0x0) {
                                  col_decay_madvises.link.qre_prev =
                                       ((col_decay_sweeps.link.qre_prev)->link).qre_prev;
                                  ((col_decay_sweeps.link.qre_prev)->link).qre_prev =
                                       &col_decay_madvises;
                                  ((((col_decay_sweeps.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_decay_sweeps.link.qre_next;
                                  ((col_decay_madvises.link.qre_prev)->link).qre_next =
                                       &col_decay_madvises;
                                }
                                col_decay_madvises.link.qre_next = col_decay_madvises.link.qre_prev;
                                col_decay_madvises.justify = emitter_justify_right;
                                col_decay_madvises.width = 0xd;
                                col_decay_madvises.type = emitter_type_title;
                                col_decay_madvises.field_3.str_val = "madvises";
                                col_decay_purged.link.qre_prev = &col_decay_purged;
                                if (col_decay_madvises.link.qre_prev != (emitter_col_t *)0x0) {
                                  col_decay_purged.link.qre_prev =
                                       ((col_decay_madvises.link.qre_prev)->link).qre_prev;
                                  ((col_decay_madvises.link.qre_prev)->link).qre_prev =
                                       &col_decay_purged;
                                  ((((col_decay_madvises.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_decay_madvises.link.qre_next;
                                  ((col_decay_purged.link.qre_prev)->link).qre_next =
                                       &col_decay_purged;
                                }
                                peVar23 = col_decay_purged.link.qre_prev;
                                col_decay_purged.justify = emitter_justify_right;
                                col_decay_purged.width = 0xd;
                                col_decay_purged.type = emitter_type_title;
                                col_decay_purged.field_3.str_val = "purged";
                                col_decay_purged.link.qre_next = col_decay_purged.link.qre_prev;
                                if (emitter->output == emitter_output_table) {
                                  if (col_decay_purged.link.qre_prev != (emitter_col_t *)0x0) {
                                    peVar22 = col_decay_purged.link.qre_prev;
                                    do {
                                      emitter_print_value(emitter,peVar22->justify,peVar22->width,
                                                          peVar22->type,&peVar22->field_3);
                                      peVar22 = (peVar22->link).qre_next;
                                      if (peVar22 == peVar23) {
                                        peVar22 = (emitter_col_t *)0x0;
                                      }
                                    } while (peVar22 != (emitter_col_t *)0x0);
                                  }
                                  emitter_table_printf(emitter,anon_var_dwarf_63fc88c + 8);
                                }
                                col_decay_type.field_3.str_val = "dirty:";
                                if (dirty_decay_ms < 0) {
                                  local_190.type = emitter_type_title;
                                  dirty_decay_ms = (ssize_t)"N/A";
                                }
                                else {
                                  local_190.type = emitter_type_ssize;
                                }
                                col_decay_npages.type = emitter_type_size;
                                col_decay_npages.field_3.size_val = pdirty;
                                col_decay_sweeps.field_3.uint64_val = dirty_npurge;
                                col_decay_madvises.field_3.uint64_val = dirty_nmadvise;
                                col_decay_purged.field_3.uint64_val = dirty_purged;
                                col_decay_purged.type = eVar17;
                                col_decay_madvises.type = eVar17;
                                col_decay_sweeps.type = eVar17;
                                if (emitter->output == emitter_output_table) {
                                  local_190.field_3.ssize_val = dirty_decay_ms;
                                  if (peVar23 != (emitter_col_t *)0x0) {
                                    peVar22 = peVar23;
                                    do {
                                      emitter_print_value(emitter,peVar22->justify,peVar22->width,
                                                          peVar22->type,&peVar22->field_3);
                                      peVar22 = (peVar22->link).qre_next;
                                      if (peVar22 == peVar23) {
                                        peVar22 = (emitter_col_t *)0x0;
                                      }
                                    } while (peVar22 != (emitter_col_t *)0x0);
                                  }
                                  emitter_table_printf(emitter,anon_var_dwarf_63fc88c + 8);
                                }
                                col_decay_type.field_3.str_val = "muzzy:";
                                if (muzzy_decay_ms < 0) {
                                  local_190.type = emitter_type_title;
                                  muzzy_decay_ms = (ssize_t)"N/A";
                                }
                                else {
                                  local_190.type = emitter_type_ssize;
                                }
                                col_decay_npages.type = emitter_type_size;
                                col_decay_npages.field_3.size_val = pmuzzy;
                                col_decay_sweeps.field_3.uint64_val = muzzy_npurge;
                                col_decay_madvises.field_3.uint64_val = muzzy_nmadvise;
                                col_decay_purged.field_3.uint64_val = muzzy_purged;
                                col_decay_purged.type = eVar17;
                                col_decay_madvises.type = eVar17;
                                col_decay_sweeps.type = eVar17;
                                local_190.field_3.ssize_val = muzzy_decay_ms;
                                if (emitter->output == emitter_output_table) {
                                  if (peVar23 != (emitter_col_t *)0x0) {
                                    peVar22 = peVar23;
                                    do {
                                      emitter_print_value(emitter,peVar22->justify,peVar22->width,
                                                          peVar22->type,&peVar22->field_3);
                                      peVar22 = (peVar22->link).qre_next;
                                      if (peVar22 == peVar23) {
                                        peVar22 = (emitter_col_t *)0x0;
                                      }
                                    } while (peVar22 != (emitter_col_t *)0x0);
                                  }
                                  emitter_table_printf(emitter,anon_var_dwarf_63fc88c + 8);
                                }
                                col_count_allocated.link.qre_next = &col_count_title;
                                col_count_title.justify = emitter_justify_left;
                                col_count_title.width = 0x15;
                                col_count_title.type = emitter_type_title;
                                col_count_title.field_3.str_val = anon_var_dwarf_63fc953 + 9;
                                col_count_title.link.qre_next = &col_count_allocated;
                                col_count_allocated.justify = emitter_justify_right;
                                col_count_allocated.width = 0x10;
                                col_count_allocated.field_3.str_val = "allocated";
                                col_count_nmalloc.link.qre_next = &col_count_nmalloc;
                                col_count_nmalloc.link.qre_prev = &col_count_nmalloc;
                                col_count_title.link.qre_prev = col_count_title.link.qre_next;
                                if (col_count_allocated.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_nmalloc.link.qre_next =
                                       col_count_allocated.link.qre_next;
                                  col_count_nmalloc.link.qre_prev = col_count_title.link.qre_next;
                                  col_count_title.link.qre_prev = &col_count_nmalloc;
                                }
                                col_count_nmalloc.justify = emitter_justify_right;
                                col_count_nmalloc.width = 0x10;
                                col_count_nmalloc.type = emitter_type_title;
                                col_count_nmalloc.field_3.str_val = "nmalloc";
                                col_count_nmalloc_ps.link.qre_next = &col_count_nmalloc_ps;
                                col_count_nmalloc_ps.link.qre_prev = &col_count_nmalloc_ps;
                                col_count_allocated.type = col_count_title.type;
                                col_count_allocated.link.qre_prev =
                                     col_count_allocated.link.qre_next;
                                if (col_count_nmalloc.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_nmalloc_ps.link.qre_next =
                                       ((col_count_nmalloc.link.qre_next)->link).qre_prev;
                                  ((col_count_nmalloc.link.qre_next)->link).qre_prev =
                                       &col_count_nmalloc_ps;
                                  col_count_nmalloc_ps.link.qre_prev =
                                       ((col_count_nmalloc_ps.link.qre_prev)->link).qre_next;
                                  ((((col_count_nmalloc.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_count_nmalloc.link.qre_next;
                                  ((col_count_nmalloc_ps.link.qre_prev)->link).qre_next =
                                       &col_count_nmalloc_ps;
                                }
                                col_count_nmalloc_ps.justify = emitter_justify_right;
                                col_count_nmalloc_ps.width = 10;
                                col_count_nmalloc_ps.type = emitter_type_title;
                                col_count_nmalloc_ps.field_3.str_val = "(#/sec)";
                                col_count_ndalloc.link.qre_prev = &col_count_ndalloc;
                                if (col_count_nmalloc_ps.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_ndalloc.link.qre_prev =
                                       ((col_count_nmalloc_ps.link.qre_next)->link).qre_prev;
                                  ((col_count_nmalloc_ps.link.qre_next)->link).qre_prev =
                                       &col_count_ndalloc;
                                  ((((col_count_nmalloc_ps.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_count_nmalloc_ps.link.qre_next;
                                  ((col_count_ndalloc.link.qre_prev)->link).qre_next =
                                       &col_count_ndalloc;
                                }
                                col_count_ndalloc.link.qre_next = col_count_ndalloc.link.qre_prev;
                                col_count_ndalloc.justify = emitter_justify_right;
                                col_count_ndalloc.width = 0x10;
                                col_count_ndalloc.type = emitter_type_title;
                                col_count_ndalloc.field_3.str_val = "ndalloc";
                                col_count_ndalloc_ps.link.qre_next = &col_count_ndalloc_ps;
                                col_count_ndalloc_ps.link.qre_prev = &col_count_ndalloc_ps;
                                if (col_count_ndalloc.link.qre_prev != (emitter_col_t *)0x0) {
                                  col_count_ndalloc_ps.link.qre_next =
                                       ((col_count_ndalloc.link.qre_prev)->link).qre_prev;
                                  ((col_count_ndalloc.link.qre_prev)->link).qre_prev =
                                       &col_count_ndalloc_ps;
                                  col_count_ndalloc_ps.link.qre_prev =
                                       ((col_count_ndalloc_ps.link.qre_prev)->link).qre_next;
                                  ((((col_count_ndalloc.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_count_ndalloc.link.qre_next;
                                  ((col_count_ndalloc_ps.link.qre_prev)->link).qre_next =
                                       &col_count_ndalloc_ps;
                                }
                                col_count_ndalloc_ps.justify = emitter_justify_right;
                                col_count_ndalloc_ps.width = 10;
                                col_count_ndalloc_ps.type = emitter_type_title;
                                col_count_ndalloc_ps.field_3.str_val = "(#/sec)";
                                col_count_nrequests.link.qre_prev = &col_count_nrequests;
                                if (col_count_ndalloc_ps.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_nrequests.link.qre_prev =
                                       ((col_count_ndalloc_ps.link.qre_next)->link).qre_prev;
                                  ((col_count_ndalloc_ps.link.qre_next)->link).qre_prev =
                                       &col_count_nrequests;
                                  ((((col_count_ndalloc_ps.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_count_ndalloc_ps.link.qre_next;
                                  ((col_count_nrequests.link.qre_prev)->link).qre_next =
                                       &col_count_nrequests;
                                }
                                col_count_nrequests.link.qre_next =
                                     col_count_nrequests.link.qre_prev;
                                col_count_nrequests.justify = emitter_justify_right;
                                col_count_nrequests.width = 0x10;
                                col_count_nrequests.type = emitter_type_title;
                                col_count_nrequests.field_3.str_val = "nrequests";
                                col_count_nrequests_ps.link.qre_next = &col_count_nrequests_ps;
                                col_count_nrequests_ps.link.qre_prev = &col_count_nrequests_ps;
                                if (col_count_nrequests.link.qre_prev != (emitter_col_t *)0x0) {
                                  col_count_nrequests_ps.link.qre_next =
                                       ((col_count_nrequests.link.qre_prev)->link).qre_prev;
                                  ((col_count_nrequests.link.qre_prev)->link).qre_prev =
                                       &col_count_nrequests_ps;
                                  col_count_nrequests_ps.link.qre_prev =
                                       ((col_count_nrequests_ps.link.qre_prev)->link).qre_next;
                                  ((((col_count_nrequests.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_count_nrequests.link.qre_next;
                                  ((col_count_nrequests_ps.link.qre_prev)->link).qre_next =
                                       &col_count_nrequests_ps;
                                }
                                col_count_nrequests_ps.justify = emitter_justify_right;
                                col_count_nrequests_ps.width = 10;
                                col_count_nrequests_ps.type = emitter_type_title;
                                col_count_nrequests_ps.field_3.str_val = "(#/sec)";
                                col_count_nfills.link.qre_prev = &col_count_nfills;
                                if (col_count_nrequests_ps.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_nfills.link.qre_prev =
                                       ((col_count_nrequests_ps.link.qre_next)->link).qre_prev;
                                  ((col_count_nrequests_ps.link.qre_next)->link).qre_prev =
                                       &col_count_nfills;
                                  ((((col_count_nrequests_ps.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_count_nrequests_ps.link.qre_next;
                                  ((col_count_nfills.link.qre_prev)->link).qre_next =
                                       &col_count_nfills;
                                }
                                col_count_nfills.link.qre_next = col_count_nfills.link.qre_prev;
                                col_count_nfills.justify = emitter_justify_right;
                                col_count_nfills.width = 0x10;
                                col_count_nfills.type = emitter_type_title;
                                col_count_nfills.field_3.str_val = "nfill";
                                col_count_nfills_ps.link.qre_next = &col_count_nfills_ps;
                                col_count_nfills_ps.link.qre_prev = &col_count_nfills_ps;
                                if (col_count_nfills.link.qre_prev != (emitter_col_t *)0x0) {
                                  col_count_nfills_ps.link.qre_next =
                                       ((col_count_nfills.link.qre_prev)->link).qre_prev;
                                  ((col_count_nfills.link.qre_prev)->link).qre_prev =
                                       &col_count_nfills_ps;
                                  col_count_nfills_ps.link.qre_prev =
                                       ((col_count_nfills_ps.link.qre_prev)->link).qre_next;
                                  ((((col_count_nfills.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_count_nfills.link.qre_next;
                                  ((col_count_nfills_ps.link.qre_prev)->link).qre_next =
                                       &col_count_nfills_ps;
                                }
                                col_count_nfills_ps.justify = emitter_justify_right;
                                col_count_nfills_ps.width = 10;
                                col_count_nfills_ps.type = emitter_type_title;
                                col_count_nfills_ps.field_3.str_val = "(#/sec)";
                                col_count_nflushes.link.qre_prev = &col_count_nflushes;
                                if (col_count_nfills_ps.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_nflushes.link.qre_prev =
                                       ((col_count_nfills_ps.link.qre_next)->link).qre_prev;
                                  ((col_count_nfills_ps.link.qre_next)->link).qre_prev =
                                       &col_count_nflushes;
                                  ((((col_count_nfills_ps.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_count_nfills_ps.link.qre_next;
                                  ((col_count_nflushes.link.qre_prev)->link).qre_next =
                                       &col_count_nflushes;
                                }
                                col_count_nflushes.link.qre_next = col_count_nflushes.link.qre_prev;
                                col_count_nflushes.justify = emitter_justify_right;
                                col_count_nflushes.width = 0x10;
                                col_count_nflushes.type = emitter_type_title;
                                col_count_nflushes.field_3.str_val = "nflush";
                                col_count_nflushes_ps.link.qre_next = &col_count_nflushes_ps;
                                col_count_nflushes_ps.link.qre_prev = &col_count_nflushes_ps;
                                if (col_count_nflushes.link.qre_prev != (emitter_col_t *)0x0) {
                                  col_count_nflushes_ps.link.qre_next =
                                       ((col_count_nflushes.link.qre_prev)->link).qre_prev;
                                  ((col_count_nflushes.link.qre_prev)->link).qre_prev =
                                       &col_count_nflushes_ps;
                                  col_count_nflushes_ps.link.qre_prev =
                                       ((col_count_nflushes_ps.link.qre_prev)->link).qre_next;
                                  ((((col_count_nflushes.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_count_nflushes.link.qre_next;
                                  ((col_count_nflushes_ps.link.qre_prev)->link).qre_next =
                                       &col_count_nflushes_ps;
                                }
                                peVar23 = col_count_nflushes_ps.link.qre_next;
                                col_count_nflushes_ps.justify = emitter_justify_right;
                                col_count_nflushes_ps.width = 10;
                                col_count_nflushes_ps.type = emitter_type_title;
                                col_count_nflushes_ps.field_3.str_val = "(#/sec)";
                                if (emitter->output == emitter_output_table) {
                                  if (col_count_nflushes_ps.link.qre_next != (emitter_col_t *)0x0) {
                                    peVar22 = col_count_nflushes_ps.link.qre_next;
                                    do {
                                      emitter_print_value(emitter,peVar22->justify,peVar22->width,
                                                          peVar22->type,&peVar22->field_3);
                                      peVar22 = (peVar22->link).qre_next;
                                      if (peVar22 == peVar23) {
                                        peVar22 = (emitter_col_t *)0x0;
                                      }
                                    } while (peVar22 != (emitter_col_t *)0x0);
                                  }
                                  emitter_table_printf(emitter,anon_var_dwarf_63fc88c + 8);
                                }
                                col_count_nflushes_ps.type = eVar17;
                                col_count_nfills_ps.type = eVar17;
                                col_count_nrequests_ps.type = eVar17;
                                col_count_ndalloc_ps.type = eVar17;
                                col_count_nmalloc_ps.type = eVar17;
                                emitter_json_object_kv_begin(emitter,"small");
                                col_count_title.field_3.str_val = "small:";
                                miblen = 7;
                                sz_1 = 8;
                                iVar8 = duckdb_je_mallctlnametomib
                                                  ("stats.arenas.0.small.allocated",&sz,&miblen);
                                aVar20 = local_978;
                                if (iVar8 != 0) {
                                  pcVar25 = 
                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                  pcVar21 = "stats.arenas.0.small.allocated";
                                  goto LAB_00d07b1c;
                                }
                                local_778[0] = local_978;
                                iVar8 = duckdb_je_mallctlbymib
                                                  (&sz,miblen,&small_allocated,&sz_1,(void *)0x0,0);
                                if (iVar8 == 0) {
                                  emitter_json_kv(emitter,"allocated",emitter_type_size,
                                                  &small_allocated);
                                  col_count_allocated.type = emitter_type_size;
                                  col_count_allocated.field_3.size_val = small_allocated;
                                  miblen = 7;
                                  sz_1 = 8;
                                  iVar8 = duckdb_je_mallctlnametomib
                                                    ("stats.arenas.0.small.nmalloc",&sz,&miblen);
                                  if (iVar8 != 0) {
                                    pcVar25 = 
                                    "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                    pcVar21 = "stats.arenas.0.small.nmalloc";
                                    goto LAB_00d07b1c;
                                  }
                                  local_778[0] = aVar20;
                                  iVar8 = duckdb_je_mallctlbymib
                                                    (&sz,miblen,&small_nmalloc,&sz_1,(void *)0x0,0);
                                  if (iVar8 == 0) {
                                    emitter_json_kv(emitter,"nmalloc",emitter_type_uint64,
                                                    &small_nmalloc);
                                    col_count_nmalloc.type = emitter_type_uint64;
                                    col_count_nmalloc.field_3.uint64_val = small_nmalloc;
                                    if (small_nmalloc == 0 || uptime == 0) {
                                      col_count_nmalloc_ps.field_3.uint64_val = 0;
                                    }
                                    else {
                                      col_count_nmalloc_ps.field_3.uint64_val = small_nmalloc;
                                      if (999999999 < uptime) {
                                        col_count_nmalloc_ps.field_3.uint64_val =
                                             small_nmalloc / (uptime / 1000000000);
                                      }
                                    }
                                    miblen = 7;
                                    sz_1 = 8;
                                    iVar8 = duckdb_je_mallctlnametomib
                                                      ("stats.arenas.0.small.ndalloc",&sz,&miblen);
                                    if (iVar8 != 0) {
                                      pcVar25 = 
                                      "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                      pcVar21 = "stats.arenas.0.small.ndalloc";
                                      goto LAB_00d07b1c;
                                    }
                                    local_778[0] = aVar20;
                                    iVar8 = duckdb_je_mallctlbymib
                                                      (&sz,miblen,&small_ndalloc,&sz_1,(void *)0x0,0
                                                      );
                                    if (iVar8 == 0) {
                                      emitter_json_kv(emitter,"ndalloc",emitter_type_uint64,
                                                      &small_ndalloc);
                                      col_count_ndalloc.type = emitter_type_uint64;
                                      col_count_ndalloc.field_3.uint64_val = small_ndalloc;
                                      if (small_ndalloc == 0 || uptime == 0) {
                                        col_count_ndalloc_ps.field_3.uint64_val = 0;
                                      }
                                      else {
                                        col_count_ndalloc_ps.field_3.uint64_val = small_ndalloc;
                                        if (999999999 < uptime) {
                                          col_count_ndalloc_ps.field_3.uint64_val =
                                               small_ndalloc / (uptime / 1000000000);
                                        }
                                      }
                                      miblen = 7;
                                      sz_1 = 8;
                                      iVar8 = duckdb_je_mallctlnametomib
                                                        ("stats.arenas.0.small.nrequests",&sz,
                                                         &miblen);
                                      if (iVar8 != 0) {
                                        pcVar25 = 
                                        "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                        pcVar21 = "stats.arenas.0.small.nrequests";
                                        goto LAB_00d07b1c;
                                      }
                                      local_778[0] = aVar20;
                                      iVar8 = duckdb_je_mallctlbymib
                                                        (&sz,miblen,&small_nrequests,&sz_1,
                                                         (void *)0x0,0);
                                      if (iVar8 == 0) {
                                        emitter_json_kv(emitter,"nrequests",emitter_type_uint64,
                                                        &small_nrequests);
                                        col_count_nrequests.type = emitter_type_uint64;
                                        col_count_nrequests.field_3.uint64_val = small_nrequests;
                                        if (small_nrequests == 0 || uptime == 0) {
                                          col_count_nrequests_ps.field_3.uint64_val = 0;
                                        }
                                        else {
                                          col_count_nrequests_ps.field_3.uint64_val =
                                               small_nrequests;
                                          if (999999999 < uptime) {
                                            col_count_nrequests_ps.field_3.uint64_val =
                                                 small_nrequests / (uptime / 1000000000);
                                          }
                                        }
                                        miblen = 7;
                                        sz_1 = 8;
                                        iVar8 = duckdb_je_mallctlnametomib
                                                          ("stats.arenas.0.small.nfills",&sz,&miblen
                                                          );
                                        if (iVar8 != 0) {
                                          pcVar25 = 
                                          "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                          pcVar21 = "stats.arenas.0.small.nfills";
                                          goto LAB_00d07b1c;
                                        }
                                        local_778[0] = aVar20;
                                        iVar8 = duckdb_je_mallctlbymib
                                                          (&sz,miblen,&small_nfills,&sz_1,
                                                           (void *)0x0,0);
                                        if (iVar8 == 0) {
                                          emitter_json_kv(emitter,"nfills",emitter_type_uint64,
                                                          &small_nfills);
                                          col_count_nfills.type = emitter_type_uint64;
                                          col_count_nfills.field_3.uint64_val = small_nfills;
                                          if (small_nfills == 0 || uptime == 0) {
                                            col_count_nfills_ps.field_3.uint64_val = 0;
                                          }
                                          else {
                                            col_count_nfills_ps.field_3.uint64_val = small_nfills;
                                            if (999999999 < uptime) {
                                              col_count_nfills_ps.field_3.uint64_val =
                                                   small_nfills / (uptime / 1000000000);
                                            }
                                          }
                                          miblen = 7;
                                          sz_1 = 8;
                                          iVar8 = duckdb_je_mallctlnametomib
                                                            ("stats.arenas.0.small.nflushes",&sz,
                                                             &miblen);
                                          if (iVar8 != 0) {
                                            pcVar25 = 
                                            "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                            ;
                                            pcVar21 = "stats.arenas.0.small.nflushes";
                                            goto LAB_00d07b1c;
                                          }
                                          local_778[0] = aVar20;
                                          iVar8 = duckdb_je_mallctlbymib
                                                            (&sz,miblen,&small_nflushes,&sz_1,
                                                             (void *)0x0,0);
                                          if (iVar8 == 0) {
                                            emitter_json_kv(emitter,"nflushes",emitter_type_uint64,
                                                            &small_nflushes);
                                            col_count_nflushes.type = emitter_type_uint64;
                                            col_count_nflushes.field_3.uint64_val = small_nflushes;
                                            if (small_nflushes == 0 || uptime == 0) {
                                              col_count_nflushes_ps.field_3.uint64_val = 0;
                                            }
                                            else {
                                              col_count_nflushes_ps.field_3.uint64_val =
                                                   small_nflushes;
                                              if (999999999 < uptime) {
                                                col_count_nflushes_ps.field_3.uint64_val =
                                                     small_nflushes / (uptime / 1000000000);
                                              }
                                            }
                                            if (emitter->output == emitter_output_table) {
                                              if (peVar23 != (emitter_col_t *)0x0) {
                                                peVar22 = peVar23;
                                                do {
                                                  emitter_print_value(emitter,peVar22->justify,
                                                                      peVar22->width,peVar22->type,
                                                                      &peVar22->field_3);
                                                  peVar22 = (peVar22->link).qre_next;
                                                  if (peVar22 == peVar23) {
                                                    peVar22 = (emitter_col_t *)0x0;
                                                  }
                                                } while (peVar22 != (emitter_col_t *)0x0);
                                              }
                                              emitter_table_printf
                                                        (emitter,anon_var_dwarf_63fc88c + 8);
                                            }
                                            if (emitter->output < emitter_output_table) {
                                              emitter->nesting_depth = emitter->nesting_depth + -1;
                                              emitter->item_at_depth = true;
                                              if (emitter->output != emitter_output_json_compact) {
                                                emitter_printf(emitter,anon_var_dwarf_63fc88c + 8);
                                                pcVar21 = anon_var_dwarf_63fcc6d + 7;
                                                if (emitter->output != emitter_output_json) {
                                                  pcVar21 = " ";
                                                }
                                                if (0 < emitter->nesting_depth) {
                                                  iVar8 = emitter->nesting_depth <<
                                                          (emitter->output != emitter_output_json);
                                                  if (iVar8 < 2) {
                                                    iVar8 = 1;
                                                  }
                                                  do {
                                                    emitter_printf(emitter,"%s",pcVar21);
                                                    iVar8 = iVar8 + -1;
                                                  } while (iVar8 != 0);
                                                }
                                              }
                                              emitter_printf(emitter,"}");
                                              aVar20 = local_978;
                                            }
                                            emitter_json_object_kv_begin(emitter,"large");
                                            col_count_title.field_3.str_val = "large:";
                                            miblen = 7;
                                            sz_1 = 8;
                                            iVar8 = duckdb_je_mallctlnametomib
                                                              ("stats.arenas.0.large.allocated",&sz,
                                                               &miblen);
                                            if (iVar8 != 0) {
                                              pcVar25 = 
                                              "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                              ;
                                              pcVar21 = "stats.arenas.0.large.allocated";
                                              goto LAB_00d07b1c;
                                            }
                                            local_778[0] = aVar20;
                                            iVar8 = duckdb_je_mallctlbymib
                                                              (&sz,miblen,&large_allocated,&sz_1,
                                                               (void *)0x0,0);
                                            if (iVar8 == 0) {
                                              emitter_json_kv(emitter,"allocated",emitter_type_size,
                                                              &large_allocated);
                                              col_count_allocated.type = emitter_type_size;
                                              col_count_allocated.field_3.size_val = large_allocated
                                              ;
                                              miblen = 7;
                                              sz_1 = 8;
                                              iVar8 = duckdb_je_mallctlnametomib
                                                                ("stats.arenas.0.large.nmalloc",&sz,
                                                                 &miblen);
                                              if (iVar8 != 0) {
                                                pcVar25 = 
                                                "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                ;
                                                pcVar21 = "stats.arenas.0.large.nmalloc";
                                                goto LAB_00d07b1c;
                                              }
                                              local_778[0] = aVar20;
                                              iVar8 = duckdb_je_mallctlbymib
                                                                (&sz,miblen,&large_nmalloc,&sz_1,
                                                                 (void *)0x0,0);
                                              if (iVar8 == 0) {
                                                emitter_json_kv(emitter,"nmalloc",
                                                                emitter_type_uint64,&large_nmalloc);
                                                col_count_nmalloc.type = emitter_type_uint64;
                                                col_count_nmalloc.field_3.uint64_val = large_nmalloc
                                                ;
                                                if (large_nmalloc == 0 || uptime == 0) {
                                                  col_count_nmalloc_ps.field_3.uint64_val = 0;
                                                }
                                                else {
                                                  col_count_nmalloc_ps.field_3.uint64_val =
                                                       large_nmalloc;
                                                  if (999999999 < uptime) {
                                                    col_count_nmalloc_ps.field_3.uint64_val =
                                                         large_nmalloc / (uptime / 1000000000);
                                                  }
                                                }
                                                miblen = 7;
                                                sz_1 = 8;
                                                iVar8 = duckdb_je_mallctlnametomib
                                                                  ("stats.arenas.0.large.ndalloc",
                                                                   &sz,&miblen);
                                                if (iVar8 != 0) {
                                                  pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.large.ndalloc";
                                                  goto LAB_00d07b1c;
                                                }
                                                local_778[0] = aVar20;
                                                iVar8 = duckdb_je_mallctlbymib
                                                                  (&sz,miblen,&large_ndalloc,&sz_1,
                                                                   (void *)0x0,0);
                                                if (iVar8 == 0) {
                                                  emitter_json_kv(emitter,"ndalloc",
                                                                  emitter_type_uint64,&large_ndalloc
                                                                 );
                                                  col_count_ndalloc.type = emitter_type_uint64;
                                                  col_count_ndalloc.field_3.uint64_val =
                                                       large_ndalloc;
                                                  if (large_ndalloc == 0 || uptime == 0) {
                                                    col_count_ndalloc_ps.field_3.uint64_val = 0;
                                                  }
                                                  else {
                                                    col_count_ndalloc_ps.field_3.uint64_val =
                                                         large_ndalloc;
                                                    if (999999999 < uptime) {
                                                      col_count_ndalloc_ps.field_3.uint64_val =
                                                           large_ndalloc / (uptime / 1000000000);
                                                    }
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    (
                                                  "stats.arenas.0.large.nrequests",&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.large.nrequests";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&large_nrequests,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"nrequests",
                                                                    emitter_type_uint64,
                                                                    &large_nrequests);
                                                    col_count_nrequests.type = emitter_type_uint64;
                                                    col_count_nrequests.field_3.uint64_val =
                                                         large_nrequests;
                                                    if (large_nrequests == 0 || uptime == 0) {
                                                      col_count_nrequests_ps.field_3.uint64_val = 0;
                                                    }
                                                    else {
                                                      col_count_nrequests_ps.field_3.uint64_val =
                                                           large_nrequests;
                                                      if (999999999 < uptime) {
                                                        col_count_nrequests_ps.field_3.uint64_val =
                                                             large_nrequests / (uptime / 1000000000)
                                                        ;
                                                      }
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      ("stats.arenas.0.large.nfills"
                                                                       ,&sz,&miblen);
                                                    if (iVar8 != 0) {
                                                      pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.large.nfills";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&large_nfills,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"nfills",
                                                                    emitter_type_uint64,
                                                                    &large_nfills);
                                                    col_count_nfills.type = emitter_type_uint64;
                                                    col_count_nfills.field_3.uint64_val =
                                                         large_nfills;
                                                    if (large_nfills == 0 || uptime == 0) {
                                                      col_count_nfills_ps.field_3.uint64_val = 0;
                                                    }
                                                    else {
                                                      col_count_nfills_ps.field_3.uint64_val =
                                                           large_nfills;
                                                      if (999999999 < uptime) {
                                                        col_count_nfills_ps.field_3.uint64_val =
                                                             large_nfills / (uptime / 1000000000);
                                                      }
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.large.nflushes",&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.large.nflushes";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&large_nflushes,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"nflushes",
                                                                    emitter_type_uint64,
                                                                    &large_nflushes);
                                                    col_count_nflushes.type = emitter_type_uint64;
                                                    col_count_nflushes.field_3.uint64_val =
                                                         large_nflushes;
                                                    if (large_nflushes == 0 || uptime == 0) {
                                                      col_count_nflushes_ps.field_3.uint64_val = 0;
                                                    }
                                                    else {
                                                      col_count_nflushes_ps.field_3.uint64_val =
                                                           large_nflushes;
                                                      if (999999999 < uptime) {
                                                        col_count_nflushes_ps.field_3.uint64_val =
                                                             large_nflushes / (uptime / 1000000000);
                                                      }
                                                    }
                                                    if (emitter->output == emitter_output_table) {
                                                      if (peVar23 != (emitter_col_t *)0x0) {
                                                        peVar22 = peVar23;
                                                        do {
                                                          emitter_print_value(emitter,peVar22->
                                                  justify,peVar22->width,peVar22->type,
                                                  &peVar22->field_3);
                                                  peVar22 = (peVar22->link).qre_next;
                                                  if (peVar22 == peVar23) {
                                                    peVar22 = (emitter_col_t *)0x0;
                                                  }
                                                  } while (peVar22 != (emitter_col_t *)0x0);
                                                  }
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  if (emitter->output < emitter_output_table) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    if (emitter->output !=
                                                        emitter_output_json_compact) {
                                                      emitter_printf(emitter,anon_var_dwarf_63fc88c
                                                                             + 8);
                                                      pcVar21 = anon_var_dwarf_63fcc6d + 7;
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar21 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar8 = emitter->nesting_depth <<
                                                                (emitter->output !=
                                                                emitter_output_json);
                                                        if (iVar8 < 2) {
                                                          iVar8 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar21);
                                                          iVar8 = iVar8 + -1;
                                                        } while (iVar8 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"}");
                                                    aVar20 = local_978;
                                                  }
                                                  col_count_ndalloc_ps.field_3.str_val =
                                                       (char *)(large_ndalloc + small_ndalloc);
                                                  col_count_title.field_3.str_val = "total:";
                                                  col_count_nrequests_ps.field_3.str_val =
                                                       (char *)(large_nrequests + small_nrequests);
                                                  col_count_allocated.field_3.str_val =
                                                       (char *)(large_allocated + small_allocated);
                                                  col_count_nfills_ps.field_3.str_val =
                                                       (char *)(large_nfills + small_nfills);
                                                  col_count_nflushes_ps.field_3.str_val =
                                                       (char *)(large_nflushes + small_nflushes);
                                                  col_count_nmalloc_ps.field_3.str_val =
                                                       (char *)(large_nmalloc + small_nmalloc);
                                                  col_count_nmalloc.field_3.uint64_val =
                                                       (uint64_t)col_count_nmalloc_ps.field_3;
                                                  col_count_ndalloc.field_3.uint64_val =
                                                       (uint64_t)col_count_ndalloc_ps.field_3;
                                                  col_count_nrequests.field_3.uint64_val =
                                                       (uint64_t)col_count_nrequests_ps.field_3;
                                                  col_count_nfills.field_3.uint64_val =
                                                       (uint64_t)col_count_nfills_ps.field_3;
                                                  col_count_nflushes.field_3.uint64_val =
                                                       (uint64_t)col_count_nflushes_ps.field_3;
                                                  if (uptime == 0 ||
                                                      col_count_nmalloc_ps.field_3.uint64_val == 0)
                                                  {
                                                    col_count_nmalloc_ps.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    col_count_nmalloc_ps.field_3.uint64_val =
                                                         col_count_nmalloc_ps.field_3.uint64_val /
                                                         (uptime / 1000000000);
                                                  }
                                                  if (col_count_ndalloc_ps.field_3.uint64_val == 0
                                                      || uptime == 0) {
                                                    col_count_ndalloc_ps.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    col_count_ndalloc_ps.field_3.uint64_val =
                                                         col_count_ndalloc_ps.field_3.uint64_val /
                                                         (uptime / 1000000000);
                                                  }
                                                  if (col_count_nrequests_ps.field_3.uint64_val == 0
                                                      || uptime == 0) {
                                                    col_count_nrequests_ps.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    col_count_nrequests_ps.field_3.uint64_val =
                                                         col_count_nrequests_ps.field_3.uint64_val /
                                                         (uptime / 1000000000);
                                                  }
                                                  if (col_count_nfills_ps.field_3.uint64_val == 0 ||
                                                      uptime == 0) {
                                                    col_count_nfills_ps.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    col_count_nfills_ps.field_3.uint64_val =
                                                         col_count_nfills_ps.field_3.uint64_val /
                                                         (uptime / 1000000000);
                                                  }
                                                  if (col_count_nflushes_ps.field_3.uint64_val == 0
                                                      || uptime == 0) {
                                                    col_count_nflushes_ps.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    col_count_nflushes_ps.field_3.uint64_val =
                                                         col_count_nflushes_ps.field_3.uint64_val /
                                                         (uptime / 1000000000);
                                                  }
                                                  if (emitter->output == emitter_output_table) {
                                                    if (peVar23 != (emitter_col_t *)0x0) {
                                                      peVar22 = peVar23;
                                                      do {
                                                        emitter_print_value(emitter,peVar22->justify
                                                                            ,peVar22->width,
                                                                            peVar22->type,
                                                                            &peVar22->field_3);
                                                        peVar22 = (peVar22->link).qre_next;
                                                        if (peVar22 == peVar23) {
                                                          peVar22 = (emitter_col_t *)0x0;
                                                        }
                                                      } while (peVar22 != (emitter_col_t *)0x0);
                                                    }
                                                    emitter_table_printf
                                                              (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  mem_count_title.justify = emitter_justify_left;
                                                  mem_count_title.width = 0x15;
                                                  mem_count_val.type = emitter_type_title;
                                                  mem_count_title.type = emitter_type_title;
                                                  mem_count_title.field_3.str_val =
                                                       anon_var_dwarf_63fc953 + 9;
                                                  mem_count_title.link.qre_prev = &mem_count_val;
                                                  mem_count_title.link.qre_next = &mem_count_val;
                                                  mem_count_val.justify = emitter_justify_right;
                                                  mem_count_val.width = 0x10;
                                                  mem_count_val.field_3.str_val =
                                                       anon_var_dwarf_63fc953 + 9;
                                                  mem_count_val.link.qre_next = &mem_count_title;
                                                  mem_count_val.link.qre_prev = &mem_count_title;
                                                  if (emitter->output == emitter_output_table) {
                                                    if (&mem_count_title != (emitter_col_t *)0x0) {
                                                      peVar23 = &mem_count_title;
                                                      do {
                                                        emitter_print_value(emitter,peVar23->justify
                                                                            ,peVar23->width,
                                                                            peVar23->type,
                                                                            &peVar23->field_3);
                                                        peVar23 = (peVar23->link).qre_next;
                                                        if (peVar23 == &mem_count_title) {
                                                          peVar23 = (emitter_col_t *)0x0;
                                                        }
                                                      } while (peVar23 != (emitter_col_t *)0x0);
                                                    }
                                                    emitter_table_printf
                                                              (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  mem_count_val.type = emitter_type_size;
                                                  mem_count_val.field_3.uint64_val = page * pactive;
                                                  mem_count_title.field_3.str_val = "active:";
                                                  if (emitter->output == emitter_output_table) {
                                                    if (&mem_count_title != (emitter_col_t *)0x0) {
                                                      peVar23 = &mem_count_title;
                                                      do {
                                                        emitter_print_value(emitter,peVar23->justify
                                                                            ,peVar23->width,
                                                                            peVar23->type,
                                                                            &peVar23->field_3);
                                                        peVar23 = (peVar23->link).qre_next;
                                                        if (peVar23 == &mem_count_title) {
                                                          peVar23 = (emitter_col_t *)0x0;
                                                        }
                                                      } while (peVar23 != (emitter_col_t *)0x0);
                                                    }
                                                    emitter_table_printf
                                                              (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    ("stats.arenas.0.mapped",&sz,
                                                                     &miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.mapped";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&mapped,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"mapped",
                                                                    emitter_type_size,&mapped);
                                                    mem_count_title.field_3.str_val = "mapped:";
                                                    mem_count_val.field_3.size_val = mapped;
                                                    if (emitter->output == emitter_output_table) {
                                                      if (&mem_count_title != (emitter_col_t *)0x0)
                                                      {
                                                        peVar23 = &mem_count_title;
                                                        do {
                                                          emitter_print_value(emitter,peVar23->
                                                  justify,peVar23->width,peVar23->type,
                                                  &peVar23->field_3);
                                                  peVar23 = (peVar23->link).qre_next;
                                                  if (peVar23 == &mem_count_title) {
                                                    peVar23 = (emitter_col_t *)0x0;
                                                  }
                                                  } while (peVar23 != (emitter_col_t *)0x0);
                                                  }
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    ("stats.arenas.0.retained",&sz,
                                                                     &miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.retained";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&retained,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"retained",
                                                                    emitter_type_size,&retained);
                                                    mem_count_title.field_3.str_val = "retained:";
                                                    mem_count_val.field_3.size_val = retained;
                                                    if (emitter->output == emitter_output_table) {
                                                      if (&mem_count_title != (emitter_col_t *)0x0)
                                                      {
                                                        peVar23 = &mem_count_title;
                                                        do {
                                                          emitter_print_value(emitter,peVar23->
                                                  justify,peVar23->width,peVar23->type,
                                                  &peVar23->field_3);
                                                  peVar23 = (peVar23->link).qre_next;
                                                  if (peVar23 == &mem_count_title) {
                                                    peVar23 = (emitter_col_t *)0x0;
                                                  }
                                                  } while (peVar23 != (emitter_col_t *)0x0);
                                                  }
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    ("stats.arenas.0.base",&sz,
                                                                     &miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.base";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&base,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"base",emitter_type_size
                                                                    ,&base);
                                                    mem_count_title.field_3.str_val = "base:";
                                                    mem_count_val.field_3.size_val = base;
                                                    if (emitter->output == emitter_output_table) {
                                                      if (&mem_count_title != (emitter_col_t *)0x0)
                                                      {
                                                        peVar23 = &mem_count_title;
                                                        do {
                                                          emitter_print_value(emitter,peVar23->
                                                  justify,peVar23->width,peVar23->type,
                                                  &peVar23->field_3);
                                                  peVar23 = (peVar23->link).qre_next;
                                                  if (peVar23 == &mem_count_title) {
                                                    peVar23 = (emitter_col_t *)0x0;
                                                  }
                                                  } while (peVar23 != (emitter_col_t *)0x0);
                                                  }
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    ("stats.arenas.0.internal",&sz,
                                                                     &miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.internal";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&internal,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"internal",
                                                                    emitter_type_size,&internal);
                                                    mem_count_title.field_3.str_val = "internal:";
                                                    mem_count_val.field_3.size_val = internal;
                                                    if (emitter->output == emitter_output_table) {
                                                      if (&mem_count_title != (emitter_col_t *)0x0)
                                                      {
                                                        peVar23 = &mem_count_title;
                                                        do {
                                                          emitter_print_value(emitter,peVar23->
                                                  justify,peVar23->width,peVar23->type,
                                                  &peVar23->field_3);
                                                  peVar23 = (peVar23->link).qre_next;
                                                  if (peVar23 == &mem_count_title) {
                                                    peVar23 = (emitter_col_t *)0x0;
                                                  }
                                                  } while (peVar23 != (emitter_col_t *)0x0);
                                                  }
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    ("stats.arenas.0.metadata_edata"
                                                                     ,&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.metadata_edata";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&metadata_edata,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"metadata_edata",
                                                                    emitter_type_size,
                                                                    &metadata_edata);
                                                    mem_count_title.field_3.str_val =
                                                         "metadata_edata:";
                                                    mem_count_val.field_3.size_val = metadata_edata;
                                                    if (emitter->output == emitter_output_table) {
                                                      if (&mem_count_title != (emitter_col_t *)0x0)
                                                      {
                                                        peVar23 = &mem_count_title;
                                                        do {
                                                          emitter_print_value(emitter,peVar23->
                                                  justify,peVar23->width,peVar23->type,
                                                  &peVar23->field_3);
                                                  peVar23 = (peVar23->link).qre_next;
                                                  if (peVar23 == &mem_count_title) {
                                                    peVar23 = (emitter_col_t *)0x0;
                                                  }
                                                  } while (peVar23 != (emitter_col_t *)0x0);
                                                  }
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    ("stats.arenas.0.metadata_rtree"
                                                                     ,&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.metadata_rtree";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&metadata_rtree,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"metadata_rtree",
                                                                    emitter_type_size,
                                                                    &metadata_rtree);
                                                    mem_count_title.field_3.str_val =
                                                         "metadata_rtree:";
                                                    mem_count_val.field_3.size_val = metadata_rtree;
                                                    if (emitter->output == emitter_output_table) {
                                                      if (&mem_count_title != (emitter_col_t *)0x0)
                                                      {
                                                        peVar23 = &mem_count_title;
                                                        do {
                                                          emitter_print_value(emitter,peVar23->
                                                  justify,peVar23->width,peVar23->type,
                                                  &peVar23->field_3);
                                                  peVar23 = (peVar23->link).qre_next;
                                                  if (peVar23 == &mem_count_title) {
                                                    peVar23 = (emitter_col_t *)0x0;
                                                  }
                                                  } while (peVar23 != (emitter_col_t *)0x0);
                                                  }
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    ("stats.arenas.0.metadata_thp",
                                                                     &sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.metadata_thp";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&metadata_thp,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"metadata_thp",
                                                                    emitter_type_size,&metadata_thp)
                                                    ;
                                                    mem_count_title.field_3.str_val =
                                                         "metadata_thp:";
                                                    mem_count_val.field_3.size_val = metadata_thp;
                                                    if (emitter->output == emitter_output_table) {
                                                      if (&mem_count_title != (emitter_col_t *)0x0)
                                                      {
                                                        peVar23 = &mem_count_title;
                                                        do {
                                                          emitter_print_value(emitter,peVar23->
                                                  justify,peVar23->width,peVar23->type,
                                                  &peVar23->field_3);
                                                  peVar23 = (peVar23->link).qre_next;
                                                  if (peVar23 == &mem_count_title) {
                                                    peVar23 = (emitter_col_t *)0x0;
                                                  }
                                                  } while (peVar23 != (emitter_col_t *)0x0);
                                                  }
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    ("stats.arenas.0.tcache_bytes",
                                                                     &sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.tcache_bytes";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&tcache_bytes,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"tcache_bytes",
                                                                    emitter_type_size,&tcache_bytes)
                                                    ;
                                                    mem_count_title.field_3.str_val =
                                                         "tcache_bytes:";
                                                    mem_count_val.field_3.size_val = tcache_bytes;
                                                    if (emitter->output == emitter_output_table) {
                                                      if (&mem_count_title != (emitter_col_t *)0x0)
                                                      {
                                                        peVar23 = &mem_count_title;
                                                        do {
                                                          emitter_print_value(emitter,peVar23->
                                                  justify,peVar23->width,peVar23->type,
                                                  &peVar23->field_3);
                                                  peVar23 = (peVar23->link).qre_next;
                                                  if (peVar23 == &mem_count_title) {
                                                    peVar23 = (emitter_col_t *)0x0;
                                                  }
                                                  } while (peVar23 != (emitter_col_t *)0x0);
                                                  }
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    (
                                                  "stats.arenas.0.tcache_stashed_bytes",&sz,&miblen)
                                                  ;
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.tcache_stashed_bytes";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,
                                                                     &tcache_stashed_bytes,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"tcache_stashed_bytes",
                                                                    emitter_type_size,
                                                                    &tcache_stashed_bytes);
                                                    mem_count_title.field_3.str_val =
                                                         "tcache_stashed_bytes:";
                                                    mem_count_val.field_3.size_val =
                                                         tcache_stashed_bytes;
                                                    if (emitter->output == emitter_output_table) {
                                                      if (&mem_count_title != (emitter_col_t *)0x0)
                                                      {
                                                        peVar23 = &mem_count_title;
                                                        do {
                                                          emitter_print_value(emitter,peVar23->
                                                  justify,peVar23->width,peVar23->type,
                                                  &peVar23->field_3);
                                                  peVar23 = (peVar23->link).qre_next;
                                                  if (peVar23 == &mem_count_title) {
                                                    peVar23 = (emitter_col_t *)0x0;
                                                  }
                                                  } while (peVar23 != (emitter_col_t *)0x0);
                                                  }
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    ("stats.arenas.0.resident",&sz,
                                                                     &miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.resident";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&resident,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"resident",
                                                                    emitter_type_size,&resident);
                                                    mem_count_title.field_3.str_val = "resident:";
                                                    mem_count_val.field_3.size_val = resident;
                                                    if (emitter->output == emitter_output_table) {
                                                      if (&mem_count_title != (emitter_col_t *)0x0)
                                                      {
                                                        peVar23 = &mem_count_title;
                                                        do {
                                                          emitter_print_value(emitter,peVar23->
                                                  justify,peVar23->width,peVar23->type,
                                                  &peVar23->field_3);
                                                  peVar23 = (peVar23->link).qre_next;
                                                  if (peVar23 == &mem_count_title) {
                                                    peVar23 = (emitter_col_t *)0x0;
                                                  }
                                                  } while (peVar23 != (emitter_col_t *)0x0);
                                                  }
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    ("stats.arenas.0.abandoned_vm",
                                                                     &sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.abandoned_vm";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&abandoned_vm,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"abandoned_vm",
                                                                    emitter_type_size,&abandoned_vm)
                                                    ;
                                                    mem_count_title.field_3.str_val =
                                                         "abandoned_vm:";
                                                    mem_count_val.field_3.size_val = abandoned_vm;
                                                    if (emitter->output == emitter_output_table) {
                                                      if (&mem_count_title != (emitter_col_t *)0x0)
                                                      {
                                                        peVar23 = &mem_count_title;
                                                        do {
                                                          emitter_print_value(emitter,peVar23->
                                                  justify,peVar23->width,peVar23->type,
                                                  &peVar23->field_3);
                                                  peVar23 = (peVar23->link).qre_next;
                                                  if (peVar23 == &mem_count_title) {
                                                    peVar23 = (emitter_col_t *)0x0;
                                                  }
                                                  } while (peVar23 != (emitter_col_t *)0x0);
                                                  }
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    ("stats.arenas.0.extent_avail",
                                                                     &sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.extent_avail";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&extent_avail,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_json_kv(emitter,"extent_avail",
                                                                    emitter_type_size,&extent_avail)
                                                    ;
                                                    mem_count_title.field_3.str_val =
                                                         "extent_avail:";
                                                    mem_count_val.field_3.size_val = extent_avail;
                                                    if (emitter->output == emitter_output_table) {
                                                      if (&mem_count_title != (emitter_col_t *)0x0)
                                                      {
                                                        peVar23 = &mem_count_title;
                                                        do {
                                                          emitter_print_value(emitter,peVar23->
                                                  justify,peVar23->width,peVar23->type,
                                                  &peVar23->field_3);
                                                  peVar23 = (peVar23->link).qre_next;
                                                  if (peVar23 == &mem_count_title) {
                                                    peVar23 = (emitter_col_t *)0x0;
                                                  }
                                                  } while (peVar23 != (emitter_col_t *)0x0);
                                                  }
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  uVar5 = uptime;
                                                  if ((char)local_924 != '\0') {
                                                    row.cols.qlh_first =
                                                         (anon_struct_8_1_803fbc3e_for_cols)
                                                         (emitter_col_t *)0x0;
                                                    mutex_stats_init_cols
                                                              (&row,anon_var_dwarf_63fc953 + 9,
                                                               (emitter_col_t *)&sz_1,
                                                               (emitter_col_t *)&sz,col32);
                                                    emitter_json_object_kv_begin(emitter,"mutexes");
                                                    eVar24 = row;
                                                    if (emitter->output == emitter_output_table) {
                                                      while (eVar24.cols.qlh_first !=
                                                             (emitter_col_t *)0x0) {
                                                        emitter_print_value(emitter,((emitter_col_t
                                                                                      *)eVar24.cols.
                                                                                        qlh_first)->
                                                                                    justify,
                                                                            ((emitter_col_t *)
                                                                            eVar24.cols.qlh_first)->
                                                                            width,((emitter_col_t *)
                                                                                  eVar24.cols.
                                                                                  qlh_first)->type,
                                                                            &((emitter_col_t *)
                                                                             eVar24.cols.qlh_first)
                                                                             ->field_3);
                                                        eVar24.cols.qlh_first =
                                                             (anon_struct_8_1_803fbc3e_for_cols)
                                                             (((emitter_col_t *)
                                                              eVar24.cols.qlh_first)->link).qre_next
                                                        ;
                                                        if (eVar24.cols.qlh_first ==
                                                            row.cols.qlh_first) {
                                                          eVar24.cols.qlh_first =
                                                               (anon_struct_8_1_803fbc3e_for_cols)
                                                               (anon_struct_8_1_803fbc3e_for_cols)
                                                               (emitter_col_t *)0x0;
                                                        }
                                                      }
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63fc88c + 8)
                                                      ;
                                                    }
                                                    miblen_new = 7;
                                                    ptVar10 = (tsd_t *)__tls_get_addr(&PTR_024e0b60)
                                                    ;
                                                    ptVar15 = ptVar10;
                                                    if ((ptVar10->state).repr != '\0') {
                                                      ptVar15 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar10,false);
                                                    }
                                                    iVar8 = duckdb_je_ctl_mibnametomib
                                                                      (ptVar15,&miblen,0,
                                                                       "stats.arenas",&miblen_new);
                                                    if (iVar8 == 0) {
                                                      local_9b8 = local_978;
                                                      miblen_new = 7;
                                                      ptVar15 = ptVar10;
                                                      if ((ptVar10->state).repr != '\0') {
                                                        ptVar15 = duckdb_je_tsd_fetch_slow
                                                                            (ptVar10,false);
                                                      }
                                                      iVar8 = duckdb_je_ctl_mibnametomib
                                                                        (ptVar15,&miblen,3,"mutexes"
                                                                         ,&miblen_new);
                                                      if (iVar8 == 0) {
                                                        uptime_s = uVar5 / 1000000000;
                                                        peVar19 = (emitter_t *)0x0;
                                                        do {
                                                          aVar20 = (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)
                                                  ((anon_union_8_10_2a69db89_for_emitter_col_s_3 *)
                                                  (duckdb_je_arena_mutex_names + (long)peVar19))->
                                                  str_val;
                                                  emitter_json_object_kv_begin
                                                            (emitter,aVar20.str_val);
                                                  miblen_new = 7;
                                                  ptVar15 = ptVar10;
                                                  if ((ptVar10->state).repr != '\0') {
                                                    ptVar15 = duckdb_je_tsd_fetch_slow
                                                                        (ptVar10,false);
                                                  }
                                                  iVar8 = duckdb_je_ctl_mibnametomib
                                                                    (ptVar15,&miblen,4,
                                                                     aVar20.str_val,&miblen_new);
                                                  if (iVar8 != 0) goto LAB_00d076f5;
                                                  local_780.int_val = 5;
                                                  miblen_new = 7;
                                                  sz_40 = 8;
                                                  ptVar15 = ptVar10;
                                                  local_9e0 = aVar20;
                                                  if ((ptVar10->state).repr != '\0') {
                                                    ptVar15 = duckdb_je_tsd_fetch_slow
                                                                        (ptVar10,false);
                                                  }
                                                  iVar8 = duckdb_je_ctl_bymibname
                                                                    (ptVar15,&miblen,5,"num_ops",
                                                                     &miblen_new,local_778,&sz_40,
                                                                     (void *)0x0,0);
                                                  if (iVar8 != 0) goto LAB_00d076db;
                                                  local_758 = 5;
                                                  local_750 = local_778[0];
                                                  if (uVar5 == 0) {
                                                    local_750.uint64_val = 0;
                                                  }
                                                  if ((emitter_col_t *)local_778[0].uint64_val !=
                                                      (emitter_col_t *)0x0 && 999999999 < uVar5) {
                                                    local_750.uint64_val =
                                                         local_778[0].uint64_val / uptime_s;
                                                  }
                                                  local_730 = 5;
                                                  miblen_new = 7;
                                                  sz_40 = 8;
                                                  ptVar15 = ptVar10;
                                                  if ((ptVar10->state).repr != '\0') {
                                                    ptVar15 = duckdb_je_tsd_fetch_slow
                                                                        (ptVar10,false);
                                                  }
                                                  iVar8 = duckdb_je_ctl_bymibname
                                                                    (ptVar15,&miblen,5,"num_wait",
                                                                     &miblen_new,local_728,&sz_40,
                                                                     (void *)0x0,0);
                                                  if (iVar8 != 0) goto LAB_00d076db;
                                                  local_708 = 5;
                                                  local_700 = local_728[0];
                                                  if (uVar5 == 0) {
                                                    local_700 = 0;
                                                  }
                                                  if (local_728[0] != 0 && 999999999 < uVar5) {
                                                    local_700 = local_728[0] / uptime_s;
                                                  }
                                                  local_6e0 = 5;
                                                  miblen_new = 7;
                                                  sz_40 = 8;
                                                  ptVar15 = ptVar10;
                                                  if ((ptVar10->state).repr != '\0') {
                                                    ptVar15 = duckdb_je_tsd_fetch_slow
                                                                        (ptVar10,false);
                                                  }
                                                  iVar8 = duckdb_je_ctl_bymibname
                                                                    (ptVar15,&miblen,5,
                                                                     "num_spin_acq",&miblen_new,
                                                                     local_6d8,&sz_40,(void *)0x0,0)
                                                  ;
                                                  if (iVar8 != 0) goto LAB_00d076db;
                                                  local_6b8 = 5;
                                                  local_6b0 = local_6d8[0];
                                                  if (uVar5 == 0) {
                                                    local_6b0 = 0;
                                                  }
                                                  if (local_6d8[0] != 0 && 999999999 < uVar5) {
                                                    local_6b0 = local_6d8[0] / uptime_s;
                                                  }
                                                  local_690 = 5;
                                                  miblen_new = 7;
                                                  sz_40 = 8;
                                                  ptVar15 = ptVar10;
                                                  if ((ptVar10->state).repr != '\0') {
                                                    ptVar15 = duckdb_je_tsd_fetch_slow
                                                                        (ptVar10,false);
                                                  }
                                                  iVar8 = duckdb_je_ctl_bymibname
                                                                    (ptVar15,&miblen,5,
                                                                     "num_owner_switch",&miblen_new,
                                                                     local_688,&sz_40,(void *)0x0,0)
                                                  ;
                                                  if (iVar8 != 0) goto LAB_00d076db;
                                                  local_668 = 5;
                                                  local_660 = local_688[0];
                                                  if (uVar5 == 0) {
                                                    local_660 = 0;
                                                  }
                                                  if (local_688[0] != 0 && 999999999 < uVar5) {
                                                    local_660 = local_688[0] / uptime_s;
                                                  }
                                                  local_640 = 5;
                                                  miblen_new = 7;
                                                  sz_40 = 8;
                                                  ptVar15 = ptVar10;
                                                  if ((ptVar10->state).repr != '\0') {
                                                    ptVar15 = duckdb_je_tsd_fetch_slow
                                                                        (ptVar10,false);
                                                  }
                                                  iVar8 = duckdb_je_ctl_bymibname
                                                                    (ptVar15,&miblen,5,
                                                                     "total_wait_time",&miblen_new,
                                                                     local_638,&sz_40,(void *)0x0,0)
                                                  ;
                                                  if (iVar8 != 0) goto LAB_00d076db;
                                                  local_618 = 5;
                                                  local_610 = local_638[0];
                                                  if (uVar5 == 0) {
                                                    local_610 = 0;
                                                  }
                                                  if (local_638[0] != 0 && 999999999 < uVar5) {
                                                    local_610 = local_638[0] / uptime_s;
                                                  }
                                                  local_5f0 = 5;
                                                  miblen_new = 7;
                                                  sz_40 = 8;
                                                  ptVar15 = ptVar10;
                                                  if ((ptVar10->state).repr != '\0') {
                                                    ptVar15 = duckdb_je_tsd_fetch_slow
                                                                        (ptVar10,false);
                                                  }
                                                  iVar8 = duckdb_je_ctl_bymibname
                                                                    (ptVar15,&miblen,5,
                                                                     "max_wait_time",&miblen_new,
                                                                     local_5e8,&sz_40,(void *)0x0,0)
                                                  ;
                                                  if (iVar8 != 0) goto LAB_00d076db;
                                                  col32[0].type = emitter_type_uint32;
                                                  miblen_new = 7;
                                                  sz_40 = 4;
                                                  ptVar15 = ptVar10;
                                                  if ((ptVar10->state).repr != '\0') {
                                                    ptVar15 = duckdb_je_tsd_fetch_slow
                                                                        (ptVar10,false);
                                                  }
                                                  iVar8 = duckdb_je_ctl_bymibname
                                                                    (ptVar15,&miblen,5,
                                                                     "max_num_thds",&miblen_new,
                                                                     &col32[0].field_3,&sz_40,
                                                                     (void *)0x0,0);
                                                  if (iVar8 != 0) goto LAB_00d076db;
                                                  mutex_stats_emit(emitter,&row,(emitter_col_t *)&sz
                                                                   ,col32);
                                                  if (emitter->output < emitter_output_table) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    local_940 = peVar19;
                                                    if (emitter->output !=
                                                        emitter_output_json_compact) {
                                                      emitter_printf(emitter,anon_var_dwarf_63fc88c
                                                                             + 8);
                                                      pcVar21 = anon_var_dwarf_63fcc6d + 7;
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar21 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar8 = emitter->nesting_depth <<
                                                                (emitter->output !=
                                                                emitter_output_json);
                                                        if (iVar8 < 2) {
                                                          iVar8 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar21);
                                                          iVar8 = iVar8 + -1;
                                                        } while (iVar8 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"}");
                                                    peVar19 = local_940;
                                                  }
                                                  peVar19 = (emitter_t *)
                                                            ((long)&peVar19->output + 1);
                                                  } while (peVar19 != (emitter_t *)0xc);
                                                  aVar20 = local_978;
                                                  if (emitter->output < emitter_output_table) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    pcVar21 = anon_var_dwarf_63fcc6d + 7;
                                                    if (emitter->output !=
                                                        emitter_output_json_compact) {
                                                      emitter_printf(emitter,anon_var_dwarf_63fc88c
                                                                             + 8);
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar21 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar8 = emitter->nesting_depth <<
                                                                (emitter->output !=
                                                                emitter_output_json);
                                                        if (iVar8 < 2) {
                                                          iVar8 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar21);
                                                          iVar8 = iVar8 + -1;
                                                        } while (iVar8 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"}");
                                                    aVar20 = local_978;
                                                  }
                                                  goto LAB_00d05cb9;
                                                  }
                                                  }
LAB_00d076f5:
                                                  pcVar21 = 
                                                  "<jemalloc>: Failure in ctl_mibnametomib()\n";
                                                  goto LAB_00d076e2;
                                                  }
LAB_00d05cb9:
                                                  if ((char)local_8ec != '\0') {
                                                    stats_arena_bins_print
                                                              (emitter,(_Bool)(char)local_924,
                                                               local_8f8.unsigned_val,uptime);
                                                  }
                                                  if ((char)local_8e8 != '\0') {
                                                    stats_arena_lextents_print
                                                              (emitter,local_8f8.unsigned_val,uptime
                                                              );
                                                  }
                                                  local_940 = emitter;
                                                  if ((char)local_8f0 != '\0') {
                                                    stats_arena_extents_print
                                                              (emitter,local_8f8.unsigned_val);
                                                  }
                                                  if (!hpa) {
                                                    return;
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    (
                                                  "stats.arenas.0.hpa_shard.npurge_passes",&sz,
                                                  &miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.hpa_shard.npurge_passes"
                                                  ;
LAB_00d07b1c:
                                                  duckdb_je_malloc_printf(pcVar25,pcVar21);
                                                  abort();
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&npurge_passes,&sz_1
                                                                     ,(void *)0x0,0);
                                                  peVar19 = local_940;
                                                  if (iVar8 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.npurges",&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.hpa_shard.npurges";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&npurges,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.nhugifies",&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.hpa_shard.nhugifies";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&nhugifies,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.ndehugifies",&sz,&miblen
                                                  );
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.hpa_shard.ndehugifies";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&ndehugifies,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_sec_bytes",&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = "stats.arenas.0.hpa_sec_bytes";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&sec_bytes,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_kv_note(peVar19,"sec_bytes",
                                                                    "Bytes in small extent cache",
                                                                    emitter_type_size,&sec_bytes,
                                                                    (char *)0x0,emitter_type_bool,
                                                                    (void *)0x0);
                                                    uVar11 = 0;
                                                    if ((npurge_passes != 0 && uptime != 0) &&
                                                       (uVar11 = npurge_passes, 999999999 < uptime))
                                                    {
                                                      uVar11 = npurge_passes / (uptime / 1000000000)
                                                      ;
                                                    }
                                                    if (npurges == 0 || uptime == 0) {
                                                      uVar12 = 0;
                                                    }
                                                    else {
                                                      uVar12 = npurges;
                                                      if (999999999 < uptime) {
                                                        uVar12 = npurges / (uptime / 1000000000);
                                                      }
                                                    }
                                                    if (nhugifies == 0 || uptime == 0) {
                                                      uVar13 = 0;
                                                    }
                                                    else {
                                                      uVar13 = nhugifies;
                                                      if (999999999 < uptime) {
                                                        uVar13 = nhugifies / (uptime / 1000000000);
                                                      }
                                                    }
                                                    if (ndehugifies == 0 || uptime == 0) {
                                                      uVar14 = 0;
                                                    }
                                                    else {
                                                      uVar14 = ndehugifies;
                                                      if (999999999 < uptime) {
                                                        uVar14 = ndehugifies / (uptime / 1000000000)
                                                        ;
                                                      }
                                                    }
                                                    emitter_table_printf
                                                              (peVar19,
                                                  "HPA shard stats:\n  Purge passes: %lu (%lu / sec)\n  Purges: %lu (%lu / sec)\n  Hugeifies: %lu (%lu / sec)\n  Dehugifies: %lu (%lu / sec)\n\n"
                                                  ,npurge_passes,uVar11,npurges,uVar12,nhugifies,
                                                  uVar13,ndehugifies,uVar14);
                                                  emitter_json_object_kv_begin(peVar19,"hpa_shard");
                                                  emitter_json_kv(peVar19,"npurge_passes",
                                                                  emitter_type_uint64,&npurge_passes
                                                                 );
                                                  emitter_json_kv(peVar19,"npurges",
                                                                  emitter_type_uint64,&npurges);
                                                  emitter_json_kv(peVar19,"nhugifies",
                                                                  emitter_type_uint64,&nhugifies);
                                                  emitter_json_kv(peVar19,"ndehugifies",
                                                                  emitter_type_uint64,&ndehugifies);
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    (
                                                  "stats.arenas.0.hpa_shard.full_slabs.npageslabs_huge"
                                                  ,&sz,&miblen);
                                                  aVar20 = local_978;
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = 
                                                  "stats.arenas.0.hpa_shard.full_slabs.npageslabs_huge"
                                                  ;
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = local_978;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&npageslabs_huge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.full_slabs.nactive_huge"
                                                  ,&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = 
                                                  "stats.arenas.0.hpa_shard.full_slabs.nactive_huge"
                                                  ;
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&nactive_huge,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.full_slabs.ndirty_huge",
                                                  &sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = 
                                                  "stats.arenas.0.hpa_shard.full_slabs.ndirty_huge";
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&ndirty_huge,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.full_slabs.npageslabs_nonhuge"
                                                  ,&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = 
                                                  "stats.arenas.0.hpa_shard.full_slabs.npageslabs_nonhuge"
                                                  ;
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&npageslabs_nonhuge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.full_slabs.nactive_nonhuge"
                                                  ,&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = 
                                                  "stats.arenas.0.hpa_shard.full_slabs.nactive_nonhuge"
                                                  ;
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&nactive_nonhuge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.full_slabs.ndirty_nonhuge"
                                                  ,&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = 
                                                  "stats.arenas.0.hpa_shard.full_slabs.ndirty_nonhuge"
                                                  ;
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&ndirty_nonhuge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_table_printf
                                                              (peVar19,
                                                  "  In full slabs:\n      npageslabs: %zu huge, %zu nonhuge\n      nactive: %zu huge, %zu nonhuge \n      ndirty: %zu huge, %zu nonhuge \n      nretained: 0 huge, %zu nonhuge \n"
                                                  ,npageslabs_huge);
                                                  emitter_json_object_kv_begin(peVar19,"full_slabs")
                                                  ;
                                                  emitter_json_kv(peVar19,"npageslabs_huge",
                                                                  emitter_type_size,&npageslabs_huge
                                                                 );
                                                  emitter_json_kv(peVar19,"nactive_huge",
                                                                  emitter_type_size,&nactive_huge);
                                                  emitter_json_kv(peVar19,"nactive_huge",
                                                                  emitter_type_size,&nactive_huge);
                                                  emitter_json_kv(peVar19,"npageslabs_nonhuge",
                                                                  emitter_type_size,
                                                                  &npageslabs_nonhuge);
                                                  emitter_json_kv(peVar19,"nactive_nonhuge",
                                                                  emitter_type_size,&nactive_nonhuge
                                                                 );
                                                  emitter_json_kv(peVar19,"ndirty_nonhuge",
                                                                  emitter_type_size,&ndirty_nonhuge)
                                                  ;
                                                  if (peVar19->output < emitter_output_table) {
                                                    peVar19->nesting_depth =
                                                         peVar19->nesting_depth + -1;
                                                    peVar19->item_at_depth = true;
                                                    if (peVar19->output !=
                                                        emitter_output_json_compact) {
                                                      emitter_printf(peVar19,anon_var_dwarf_63fc88c
                                                                             + 8);
                                                      pcVar21 = anon_var_dwarf_63fcc6d + 7;
                                                      if (peVar19->output != emitter_output_json) {
                                                        pcVar21 = " ";
                                                      }
                                                      if (0 < peVar19->nesting_depth) {
                                                        iVar8 = peVar19->nesting_depth <<
                                                                (peVar19->output !=
                                                                emitter_output_json);
                                                        if (iVar8 < 2) {
                                                          iVar8 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(peVar19,"%s",pcVar21);
                                                          iVar8 = iVar8 + -1;
                                                        } while (iVar8 != 0);
                                                      }
                                                    }
                                                    emitter_printf(peVar19,"}");
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar8 = duckdb_je_mallctlnametomib
                                                                    (
                                                  "stats.arenas.0.hpa_shard.empty_slabs.npageslabs_huge"
                                                  ,&sz,&miblen);
                                                  aVar20 = local_978;
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = 
                                                  "stats.arenas.0.hpa_shard.empty_slabs.npageslabs_huge"
                                                  ;
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = local_978;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&npageslabs_huge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.empty_slabs.nactive_huge"
                                                  ,&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = 
                                                  "stats.arenas.0.hpa_shard.empty_slabs.nactive_huge"
                                                  ;
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&nactive_huge,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.empty_slabs.ndirty_huge"
                                                  ,&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = 
                                                  "stats.arenas.0.hpa_shard.empty_slabs.ndirty_huge"
                                                  ;
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&ndirty_huge,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.empty_slabs.npageslabs_nonhuge"
                                                  ,&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = 
                                                  "stats.arenas.0.hpa_shard.empty_slabs.npageslabs_nonhuge"
                                                  ;
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&npageslabs_nonhuge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.empty_slabs.nactive_nonhuge"
                                                  ,&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = 
                                                  "stats.arenas.0.hpa_shard.empty_slabs.nactive_nonhuge"
                                                  ;
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&nactive_nonhuge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar8 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.empty_slabs.ndirty_nonhuge"
                                                  ,&sz,&miblen);
                                                  if (iVar8 != 0) {
                                                    pcVar25 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar21 = 
                                                  "stats.arenas.0.hpa_shard.empty_slabs.ndirty_nonhuge"
                                                  ;
                                                  goto LAB_00d07b1c;
                                                  }
                                                  local_778[0] = aVar20;
                                                  iVar8 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&ndirty_nonhuge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar8 == 0) {
                                                    emitter_table_printf
                                                              (peVar19,
                                                  "  In empty slabs:\n      npageslabs: %zu huge, %zu nonhuge\n      nactive: %zu huge, %zu nonhuge \n      ndirty: %zu huge, %zu nonhuge \n      nretained: 0 huge, %zu nonhuge \n"
                                                  ,npageslabs_huge,npageslabs_nonhuge,nactive_huge,
                                                  nactive_nonhuge,ndirty_huge,ndirty_nonhuge,
                                                  (npageslabs_nonhuge * 0x200 - nactive_nonhuge) -
                                                  ndirty_nonhuge);
                                                  emitter_json_object_kv_begin
                                                            (peVar19,"empty_slabs");
                                                  eVar17 = emitter_type_size;
                                                  emitter_json_kv(peVar19,"npageslabs_huge",
                                                                  emitter_type_size,&npageslabs_huge
                                                                 );
                                                  emitter_json_kv(peVar19,"nactive_huge",
                                                                  emitter_type_size,&nactive_huge);
                                                  emitter_json_kv(peVar19,"nactive_huge",
                                                                  emitter_type_size,&nactive_huge);
                                                  emitter_json_kv(peVar19,"npageslabs_nonhuge",
                                                                  emitter_type_size,
                                                                  &npageslabs_nonhuge);
                                                  emitter_json_kv(peVar19,"nactive_nonhuge",
                                                                  emitter_type_size,&nactive_nonhuge
                                                                 );
                                                  emitter_json_kv(peVar19,"ndirty_nonhuge",
                                                                  emitter_type_size,&ndirty_nonhuge)
                                                  ;
                                                  if (peVar19->output < emitter_output_table) {
                                                    peVar19->nesting_depth =
                                                         peVar19->nesting_depth + -1;
                                                    peVar19->item_at_depth = true;
                                                    if (peVar19->output !=
                                                        emitter_output_json_compact) {
                                                      emitter_printf(peVar19,anon_var_dwarf_63fc88c
                                                                             + 8);
                                                      pcVar21 = anon_var_dwarf_63fcc6d + 7;
                                                      if (peVar19->output != emitter_output_json) {
                                                        pcVar21 = " ";
                                                      }
                                                      if (0 < peVar19->nesting_depth) {
                                                        iVar8 = peVar19->nesting_depth <<
                                                                (peVar19->output !=
                                                                emitter_output_json);
                                                        if (iVar8 < 2) {
                                                          iVar8 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(peVar19,"%s",pcVar21);
                                                          iVar8 = iVar8 + -1;
                                                        } while (iVar8 != 0);
                                                      }
                                                    }
                                                    emitter_printf(peVar19,"}");
                                                  }
                                                  aVar20 = local_978;
                                                  miblen = 0x1400000001;
                                                  local_900 = (emitter_col_t *)&sz_1;
                                                  sz_1 = 0x1400000001;
                                                  local_9e8 = emitter_type_title;
                                                  local_9e0.str_val = "size";
                                                  local_9b0 = col32;
                                                  col32[0].justify = emitter_justify_right;
                                                  col32[0].width = 4;
                                                  col32[0].type = emitter_type_unsigned;
                                                  local_9d8 = (emitter_col_t *)&miblen_new;
                                                  miblen_new = 0x400000001;
                                                  local_910.str_val = "ind";
                                                  col32[0].link.qre_next = (emitter_col_t *)&sz_40;
                                                  sz_40 = 0x1000000001;
                                                  local_908 = (emitter_col_t *)&row;
                                                  row.cols.qlh_first =
                                                       (anon_struct_8_1_803fbc3e_for_cols)
                                                       (emitter_col_t *)0x1000000001;
                                                  local_8c8 = &col_nactive_huge;
                                                  col_nactive_huge.justify = emitter_justify_right;
                                                  col_nactive_huge.width = 0x10;
                                                  header_nactive_huge.justify =
                                                       emitter_justify_right;
                                                  header_nactive_huge.width = 0x10;
                                                  header_nactive_huge.field_3.str_val =
                                                       "nactive_huge";
                                                  local_9a8 = local_8c8;
                                                  peVar23 = &col_ndirty_huge;
                                                  col_ndirty_huge.link.qre_prev = &col_ndirty_huge;
                                                  if ((emitter_col_t *)&miblen !=
                                                      (emitter_col_t *)0x0) {
                                                    col_ndirty_huge.link.qre_prev =
                                                         col_ndirty_huge.link.qre_next;
                                                    ((col_ndirty_huge.link.qre_next)->link).qre_next
                                                         = &col_ndirty_huge;
                                                    local_9a8 = &col_ndirty_huge;
                                                    peVar23 = local_8c8;
                                                  }
                                                  col_ndirty_huge.link.qre_next = peVar23;
                                                  col_ndirty_huge.justify = emitter_justify_right;
                                                  col_ndirty_huge.width = 0x10;
                                                  col_ndirty_huge.type = emitter_type_size;
                                                  peVar23 = &header_nactive_huge;
                                                  peVar22 = &header_ndirty_huge;
                                                  header_ndirty_huge.link.qre_prev =
                                                       &header_ndirty_huge;
                                                  if (local_900 != (emitter_col_t *)0x0) {
                                                    header_ndirty_huge.link.qre_prev =
                                                         header_ndirty_huge.link.qre_next;
                                                    ((header_ndirty_huge.link.qre_next)->link).
                                                    qre_next = &header_ndirty_huge;
                                                    peVar23 = &header_ndirty_huge;
                                                    peVar22 = local_9d0;
                                                  }
                                                  header_ndirty_huge.link.qre_next = peVar22;
                                                  local_9d0 = peVar23;
                                                  header_ndirty_huge.justify = emitter_justify_right
                                                  ;
                                                  header_ndirty_huge.width = 0x10;
                                                  header_ndirty_huge.type = emitter_type_title;
                                                  header_ndirty_huge.field_3.str_val = "ndirty_huge"
                                                  ;
                                                  col_npageslabs_nonhuge.link.qre_prev =
                                                       &col_npageslabs_nonhuge;
                                                  col32[0].link.qre_prev = (emitter_col_t *)&miblen;
                                                  col_nactive_huge.type = eVar17;
                                                  col_nactive_huge.link.qre_next =
                                                       (emitter_col_t *)&miblen;
                                                  col_nactive_huge.link.qre_prev =
                                                       col32[0].link.qre_next;
                                                  header_nactive_huge.type = local_9e8;
                                                  header_nactive_huge.link.qre_next = local_900;
                                                  header_nactive_huge.link.qre_prev = local_908;
                                                  if (col_ndirty_huge.link.qre_next !=
                                                      (emitter_col_t *)0x0) {
                                                    col_npageslabs_nonhuge.link.qre_prev =
                                                         ((col_ndirty_huge.link.qre_next)->link).
                                                         qre_prev;
                                                    ((col_ndirty_huge.link.qre_next)->link).qre_prev
                                                         = &col_npageslabs_nonhuge;
                                                    ((((col_ndirty_huge.link.qre_next)->link).
                                                     qre_prev)->link).qre_next =
                                                         col_ndirty_huge.link.qre_next;
                                                    ((col_npageslabs_nonhuge.link.qre_prev)->link).
                                                    qre_next = &col_npageslabs_nonhuge;
                                                  }
                                                  col_npageslabs_nonhuge.link.qre_next =
                                                       col_npageslabs_nonhuge.link.qre_prev;
                                                  col_npageslabs_nonhuge.justify =
                                                       emitter_justify_right;
                                                  col_npageslabs_nonhuge.width = 0x14;
                                                  col_npageslabs_nonhuge.type = emitter_type_size;
                                                  header_npageslabs_nonhuge.link.qre_prev =
                                                       &header_npageslabs_nonhuge;
                                                  if (header_ndirty_huge.link.qre_next !=
                                                      (emitter_col_t *)0x0) {
                                                    header_npageslabs_nonhuge.link.qre_prev =
                                                         ((header_ndirty_huge.link.qre_next)->link).
                                                         qre_prev;
                                                    ((header_ndirty_huge.link.qre_next)->link).
                                                    qre_prev = &header_npageslabs_nonhuge;
                                                    ((((header_ndirty_huge.link.qre_next)->link).
                                                     qre_prev)->link).qre_next =
                                                         header_ndirty_huge.link.qre_next;
                                                    ((header_npageslabs_nonhuge.link.qre_prev)->link
                                                    ).qre_next = &header_npageslabs_nonhuge;
                                                  }
                                                  header_npageslabs_nonhuge.link.qre_next =
                                                       header_npageslabs_nonhuge.link.qre_prev;
                                                  header_npageslabs_nonhuge.justify =
                                                       emitter_justify_right;
                                                  header_npageslabs_nonhuge.width = 0x14;
                                                  header_npageslabs_nonhuge.type =
                                                       emitter_type_title;
                                                  header_npageslabs_nonhuge.field_3.str_val =
                                                       "npageslabs_nonhuge";
                                                  col_nactive_nonhuge.link.qre_prev =
                                                       &col_nactive_nonhuge;
                                                  if (col_npageslabs_nonhuge.link.qre_prev !=
                                                      (emitter_col_t *)0x0) {
                                                    col_nactive_nonhuge.link.qre_prev =
                                                         ((col_npageslabs_nonhuge.link.qre_prev)->
                                                         link).qre_prev;
                                                    ((col_npageslabs_nonhuge.link.qre_prev)->link).
                                                    qre_prev = &col_nactive_nonhuge;
                                                    ((((col_npageslabs_nonhuge.link.qre_next)->link)
                                                     .qre_prev)->link).qre_next =
                                                         col_npageslabs_nonhuge.link.qre_next;
                                                    ((col_nactive_nonhuge.link.qre_prev)->link).
                                                    qre_next = &col_nactive_nonhuge;
                                                  }
                                                  col_nactive_nonhuge.link.qre_next =
                                                       col_nactive_nonhuge.link.qre_prev;
                                                  col_nactive_nonhuge.justify =
                                                       emitter_justify_right;
                                                  col_nactive_nonhuge.width = 0x14;
                                                  col_nactive_nonhuge.type = emitter_type_size;
                                                  header_nactive_nonhuge.link.qre_prev =
                                                       &header_nactive_nonhuge;
                                                  if (header_npageslabs_nonhuge.link.qre_prev !=
                                                      (emitter_col_t *)0x0) {
                                                    header_nactive_nonhuge.link.qre_prev =
                                                         ((header_npageslabs_nonhuge.link.qre_prev)
                                                         ->link).qre_prev;
                                                    ((header_npageslabs_nonhuge.link.qre_prev)->link
                                                    ).qre_prev = &header_nactive_nonhuge;
                                                    ((((header_npageslabs_nonhuge.link.qre_next)->
                                                      link).qre_prev)->link).qre_next =
                                                         header_npageslabs_nonhuge.link.qre_next;
                                                    ((header_nactive_nonhuge.link.qre_prev)->link).
                                                    qre_next = &header_nactive_nonhuge;
                                                  }
                                                  header_nactive_nonhuge.link.qre_next =
                                                       header_nactive_nonhuge.link.qre_prev;
                                                  header_nactive_nonhuge.justify =
                                                       emitter_justify_right;
                                                  header_nactive_nonhuge.width = 0x14;
                                                  header_nactive_nonhuge.type = emitter_type_title;
                                                  header_nactive_nonhuge.field_3.str_val =
                                                       "nactive_nonhuge";
                                                  col_ndirty_nonhuge.link.qre_prev =
                                                       &col_ndirty_nonhuge;
                                                  if (col_nactive_nonhuge.link.qre_prev !=
                                                      (emitter_col_t *)0x0) {
                                                    col_ndirty_nonhuge.link.qre_prev =
                                                         ((col_nactive_nonhuge.link.qre_prev)->link)
                                                         .qre_prev;
                                                    ((col_nactive_nonhuge.link.qre_prev)->link).
                                                    qre_prev = &col_ndirty_nonhuge;
                                                    ((((col_nactive_nonhuge.link.qre_next)->link).
                                                     qre_prev)->link).qre_next =
                                                         col_nactive_nonhuge.link.qre_next;
                                                    ((col_ndirty_nonhuge.link.qre_prev)->link).
                                                    qre_next = &col_ndirty_nonhuge;
                                                  }
                                                  col_ndirty_nonhuge.link.qre_next =
                                                       col_ndirty_nonhuge.link.qre_prev;
                                                  col_ndirty_nonhuge.justify = emitter_justify_right
                                                  ;
                                                  col_ndirty_nonhuge.width = 0x14;
                                                  col_ndirty_nonhuge.type = emitter_type_size;
                                                  header_ndirty_nonhuge.link.qre_prev =
                                                       &header_ndirty_nonhuge;
                                                  if (header_nactive_nonhuge.link.qre_prev !=
                                                      (emitter_col_t *)0x0) {
                                                    header_ndirty_nonhuge.link.qre_prev =
                                                         ((header_nactive_nonhuge.link.qre_prev)->
                                                         link).qre_prev;
                                                    ((header_nactive_nonhuge.link.qre_prev)->link).
                                                    qre_prev = &header_ndirty_nonhuge;
                                                    ((((header_nactive_nonhuge.link.qre_next)->link)
                                                     .qre_prev)->link).qre_next =
                                                         header_nactive_nonhuge.link.qre_next;
                                                    ((header_ndirty_nonhuge.link.qre_prev)->link).
                                                    qre_next = &header_ndirty_nonhuge;
                                                  }
                                                  header_ndirty_nonhuge.link.qre_next =
                                                       header_ndirty_nonhuge.link.qre_prev;
                                                  header_ndirty_nonhuge.justify =
                                                       emitter_justify_right;
                                                  header_ndirty_nonhuge.width = 0x14;
                                                  header_ndirty_nonhuge.type = emitter_type_title;
                                                  header_ndirty_nonhuge.field_3.str_val =
                                                       "ndirty_nonhuge";
                                                  col_nretained_nonhuge.link.qre_prev =
                                                       &col_nretained_nonhuge;
                                                  if (col_ndirty_nonhuge.link.qre_prev !=
                                                      (emitter_col_t *)0x0) {
                                                    col_nretained_nonhuge.link.qre_prev =
                                                         ((col_ndirty_nonhuge.link.qre_prev)->link).
                                                         qre_prev;
                                                    ((col_ndirty_nonhuge.link.qre_prev)->link).
                                                    qre_prev = &col_nretained_nonhuge;
                                                    ((((col_ndirty_nonhuge.link.qre_next)->link).
                                                     qre_prev)->link).qre_next =
                                                         col_ndirty_nonhuge.link.qre_next;
                                                    ((col_nretained_nonhuge.link.qre_prev)->link).
                                                    qre_next = &col_nretained_nonhuge;
                                                  }
                                                  peVar23 = col_nretained_nonhuge.link.qre_prev;
                                                  col_nretained_nonhuge.justify =
                                                       emitter_justify_right;
                                                  col_nretained_nonhuge.width = 0x14;
                                                  col_nretained_nonhuge.type = emitter_type_size;
                                                  header_nretained_nonhuge.link.qre_prev =
                                                       &header_nretained_nonhuge;
                                                  if (header_ndirty_nonhuge.link.qre_prev !=
                                                      (emitter_col_t *)0x0) {
                                                    header_nretained_nonhuge.link.qre_prev =
                                                         ((header_ndirty_nonhuge.link.qre_prev)->
                                                         link).qre_prev;
                                                    ((header_ndirty_nonhuge.link.qre_prev)->link).
                                                    qre_prev = &header_nretained_nonhuge;
                                                    ((((header_ndirty_nonhuge.link.qre_next)->link).
                                                     qre_prev)->link).qre_next =
                                                         header_ndirty_nonhuge.link.qre_next;
                                                    ((header_nretained_nonhuge.link.qre_prev)->link)
                                                    .qre_next = &header_nretained_nonhuge;
                                                  }
                                                  peVar22 = header_nretained_nonhuge.link.qre_prev;
                                                  header_nretained_nonhuge.justify =
                                                       emitter_justify_right;
                                                  header_nretained_nonhuge.width = 0x14;
                                                  header_nretained_nonhuge.type = emitter_type_title
                                                  ;
                                                  header_nretained_nonhuge.field_3.str_val =
                                                       "nretained_nonhuge";
                                                  miblen_new_9 = 7;
                                                  local_9c0 = eVar17;
                                                  local_918 = local_9e8;
                                                  local_8d8 = eVar17;
                                                  local_8c0 = local_9b0;
                                                  header_nretained_nonhuge.link.qre_next =
                                                       header_nretained_nonhuge.link.qre_prev;
                                                  col_nretained_nonhuge.link.qre_next =
                                                       col_nretained_nonhuge.link.qre_prev;
                                                  ptVar10 = (tsd_t *)__tls_get_addr(&PTR_024e0b60);
                                                  ptVar15 = ptVar10;
                                                  if ((ptVar10->state).repr != '\0') {
                                                    ptVar15 = duckdb_je_tsd_fetch_slow
                                                                        (ptVar10,false);
                                                  }
                                                  iVar8 = duckdb_je_ctl_mibnametomib
                                                                    (ptVar15,&sz,0,"stats.arenas",
                                                                     &miblen_new_9);
                                                  if (iVar8 == 0) {
                                                    local_778[0] = aVar20;
                                                    miblen_new_9 = 7;
                                                    ptVar15 = ptVar10;
                                                    if ((ptVar10->state).repr != '\0') {
                                                      ptVar15 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar10,false);
                                                    }
                                                    iVar8 = duckdb_je_ctl_mibnametomib
                                                                      (ptVar15,&sz,3,
                                                                       "hpa_shard.nonfull_slabs",
                                                                       &miblen_new_9);
                                                    if (iVar8 == 0) {
                                                      emitter_table_printf
                                                                (peVar19,"  In nonfull slabs:\n");
                                                      if (peVar19->output == emitter_output_table) {
                                                        if (peVar22 != (emitter_col_t *)0x0) {
                                                          peVar26 = peVar22;
                                                          do {
                                                            emitter_print_value(peVar19,peVar26->
                                                  justify,peVar26->width,peVar26->type,
                                                  &peVar26->field_3);
                                                  peVar26 = (peVar26->link).qre_next;
                                                  if (peVar26 == peVar22) {
                                                    peVar26 = (emitter_col_t *)0x0;
                                                  }
                                                  } while (peVar26 != (emitter_col_t *)0x0);
                                                  }
                                                  emitter_table_printf
                                                            (peVar19,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  local_978.str_val = (char *)peVar23;
                                                  emitter_json_array_kv_begin
                                                            (peVar19,"nonfull_slabs");
                                                  aVar20.uint64_val = 0;
                                                  bVar18 = 0;
                                                  while( true ) {
                                                    miblen_new_9 = 7;
                                                    sz_63 = 8;
                                                    ptVar15 = ptVar10;
                                                    local_760 = aVar20;
                                                    if ((ptVar10->state).repr != '\0') {
                                                      ptVar15 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar10,false);
                                                    }
                                                    iVar8 = duckdb_je_ctl_bymibname
                                                                      (ptVar15,&sz,6,
                                                                       "npageslabs_huge",
                                                                       &miblen_new_9,
                                                                       &npageslabs_huge,&sz_63,
                                                                       (void *)0x0,0);
                                                    if (iVar8 != 0) break;
                                                    miblen_new_9 = 7;
                                                    sz_63 = 8;
                                                    ptVar15 = ptVar10;
                                                    if ((ptVar10->state).repr != '\0') {
                                                      ptVar15 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar10,false);
                                                    }
                                                    iVar8 = duckdb_je_ctl_bymibname
                                                                      (ptVar15,&sz,6,"nactive_huge",
                                                                       &miblen_new_9,&nactive_huge,
                                                                       &sz_63,(void *)0x0,0);
                                                    if (iVar8 != 0) break;
                                                    miblen_new_9 = 7;
                                                    sz_63 = 8;
                                                    ptVar15 = ptVar10;
                                                    if ((ptVar10->state).repr != '\0') {
                                                      ptVar15 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar10,false);
                                                    }
                                                    iVar8 = duckdb_je_ctl_bymibname
                                                                      (ptVar15,&sz,6,"ndirty_huge",
                                                                       &miblen_new_9,&ndirty_huge,
                                                                       &sz_63,(void *)0x0,0);
                                                    if (iVar8 != 0) break;
                                                    miblen_new_9 = 7;
                                                    sz_63 = 8;
                                                    ptVar15 = ptVar10;
                                                    if ((ptVar10->state).repr != '\0') {
                                                      ptVar15 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar10,false);
                                                    }
                                                    iVar8 = duckdb_je_ctl_bymibname
                                                                      (ptVar15,&sz,6,
                                                                       "npageslabs_nonhuge",
                                                                       &miblen_new_9,
                                                                       &npageslabs_nonhuge,&sz_63,
                                                                       (void *)0x0,0);
                                                    if (iVar8 != 0) break;
                                                    miblen_new_9 = 7;
                                                    sz_63 = 8;
                                                    ptVar15 = ptVar10;
                                                    if ((ptVar10->state).repr != '\0') {
                                                      ptVar15 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar10,false);
                                                    }
                                                    iVar8 = duckdb_je_ctl_bymibname
                                                                      (ptVar15,&sz,6,
                                                                       "nactive_nonhuge",
                                                                       &miblen_new_9,
                                                                       &nactive_nonhuge,&sz_63,
                                                                       (void *)0x0,0);
                                                    if (iVar8 != 0) break;
                                                    miblen_new_9 = 7;
                                                    sz_63 = 8;
                                                    ptVar15 = ptVar10;
                                                    if ((ptVar10->state).repr != '\0') {
                                                      ptVar15 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar10,false);
                                                    }
                                                    iVar8 = duckdb_je_ctl_bymibname
                                                                      (ptVar15,&sz,6,
                                                                       "ndirty_nonhuge",
                                                                       &miblen_new_9,&ndirty_nonhuge
                                                                       ,&sz_63,(void *)0x0,0);
                                                    sVar7 = npageslabs_nonhuge;
                                                    if (iVar8 != 0) break;
                                                    lVar16 = nactive_nonhuge + ndirty_nonhuge;
                                                    bVar2 = npageslabs_huge == 0;
                                                    bVar3 = npageslabs_nonhuge == 0;
                                                    if ((~bVar18 & 1) == 0 && (!bVar2 || !bVar3)) {
                                                      emitter_table_printf
                                                                (local_940,
                                                                 "                     ---\n");
                                                    }
                                                    peVar19 = local_940;
                                                    aVar6 = local_978;
                                                    col_nretained_nonhuge.field_3.str_val =
                                                         (char *)(sVar7 * 0x200 - lVar16);
                                                    local_9b8 = *(
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3 *)
                                                  (duckdb_je_sz_pind2sz_tab + aVar20.uint64_val);
                                                  local_8d0.size_val = npageslabs_huge;
                                                  col_nactive_huge.field_3.size_val = nactive_huge;
                                                  col_ndirty_huge.field_3.size_val = ndirty_huge;
                                                  col_npageslabs_nonhuge.field_3.size_val =
                                                       npageslabs_nonhuge;
                                                  col_nactive_nonhuge.field_3.size_val =
                                                       nactive_nonhuge;
                                                  col_ndirty_nonhuge.field_3.size_val =
                                                       ndirty_nonhuge;
                                                  col32[0].field_3 = aVar20;
                                                  if ((!bVar2 || !bVar3) &&
                                                     (aVar4 = local_978,
                                                     local_940->output == emitter_output_table)) {
                                                    while ((emitter_col_t *)aVar4.uint64_val !=
                                                           (emitter_col_t *)0x0) {
                                                      emitter_print_value(peVar19,*(
                                                  emitter_justify_t *)aVar4.str_val,
                                                  *(int *)(aVar4.uint64_val + 4),
                                                  *(emitter_type_t *)(aVar4.uint64_val + 8),
                                                  (anon_union_8_10_2a69db89_for_emitter_col_s_3 *)
                                                  (aVar4.uint64_val + 0x10));
                                                  paVar1 = (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3 *)
                                                  (aVar4.uint64_val + 0x18);
                                                  aVar4.uint64_val = 0;
                                                  if (paVar1->str_val != (char *)aVar6.uint64_val) {
                                                    aVar4.str_val = paVar1->str_val;
                                                  }
                                                  }
                                                  emitter_table_printf
                                                            (peVar19,anon_var_dwarf_63fc88c + 8);
                                                  }
                                                  uptime_s = CONCAT71(uptime_s._1_7_,bVar2 && bVar3)
                                                  ;
                                                  bVar18 = bVar2 && bVar3;
                                                  if (peVar19->output < emitter_output_table) {
                                                    if (peVar19->emitted_key == true) {
                                                      peVar19->emitted_key = false;
                                                    }
                                                    else {
                                                      if (peVar19->item_at_depth == true) {
                                                        emitter_printf(peVar19,",");
                                                      }
                                                      if (peVar19->output !=
                                                          emitter_output_json_compact) {
                                                        emitter_printf(peVar19,
                                                  anon_var_dwarf_63fc88c + 8);
                                                  pcVar21 = anon_var_dwarf_63fcc6d + 7;
                                                  if (peVar19->output != emitter_output_json) {
                                                    pcVar21 = " ";
                                                  }
                                                  if (0 < peVar19->nesting_depth) {
                                                    iVar8 = peVar19->nesting_depth <<
                                                            (peVar19->output != emitter_output_json)
                                                    ;
                                                    if (iVar8 < 2) {
                                                      iVar8 = 1;
                                                    }
                                                    do {
                                                      emitter_printf(peVar19,"%s",pcVar21);
                                                      iVar8 = iVar8 + -1;
                                                    } while (iVar8 != 0);
                                                  }
                                                  }
                                                  }
                                                  emitter_printf(peVar19,"{");
                                                  peVar19->nesting_depth =
                                                       peVar19->nesting_depth + 1;
                                                  peVar19->item_at_depth = false;
                                                  bVar18 = (byte)uptime_s;
                                                  }
                                                  emitter_json_kv(peVar19,"npageslabs_huge",
                                                                  emitter_type_size,&npageslabs_huge
                                                                 );
                                                  emitter_json_kv(peVar19,"nactive_huge",
                                                                  emitter_type_size,&nactive_huge);
                                                  emitter_json_kv(peVar19,"ndirty_huge",
                                                                  emitter_type_size,&ndirty_huge);
                                                  emitter_json_kv(peVar19,"npageslabs_nonhuge",
                                                                  emitter_type_size,
                                                                  &npageslabs_nonhuge);
                                                  emitter_json_kv(peVar19,"nactive_nonhuge",
                                                                  emitter_type_size,&nactive_nonhuge
                                                                 );
                                                  emitter_json_kv(peVar19,"ndirty_nonhuge",
                                                                  emitter_type_size,&ndirty_nonhuge)
                                                  ;
                                                  if (peVar19->output < emitter_output_table) {
                                                    peVar19->nesting_depth =
                                                         peVar19->nesting_depth + -1;
                                                    peVar19->item_at_depth = true;
                                                    if (peVar19->output !=
                                                        emitter_output_json_compact) {
                                                      emitter_printf(peVar19,anon_var_dwarf_63fc88c
                                                                             + 8);
                                                      pcVar21 = anon_var_dwarf_63fcc6d + 7;
                                                      if (peVar19->output != emitter_output_json) {
                                                        pcVar21 = " ";
                                                      }
                                                      if (0 < peVar19->nesting_depth) {
                                                        iVar8 = peVar19->nesting_depth <<
                                                                (peVar19->output !=
                                                                emitter_output_json);
                                                        if (iVar8 < 2) {
                                                          iVar8 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(peVar19,"%s",pcVar21);
                                                          iVar8 = iVar8 + -1;
                                                        } while (iVar8 != 0);
                                                      }
                                                    }
                                                    emitter_printf(peVar19,"}");
                                                    bVar18 = (byte)uptime_s;
                                                  }
                                                  aVar20.str_val = (char *)(aVar20.uint64_val + 1);
                                                  if (aVar20.uint64_val == 0x40) {
                                                    pcVar21 = anon_var_dwarf_63fcc6d + 7;
                                                    if (peVar19->output < emitter_output_table) {
                                                      peVar19->nesting_depth =
                                                           peVar19->nesting_depth + -1;
                                                      peVar19->item_at_depth = true;
                                                      if (peVar19->output !=
                                                          emitter_output_json_compact) {
                                                        emitter_printf(peVar19,
                                                  anon_var_dwarf_63fc88c + 8);
                                                  pcVar25 = anon_var_dwarf_63fcc6d + 7;
                                                  if (peVar19->output != emitter_output_json) {
                                                    pcVar25 = " ";
                                                  }
                                                  if (0 < peVar19->nesting_depth) {
                                                    iVar8 = peVar19->nesting_depth <<
                                                            (peVar19->output != emitter_output_json)
                                                    ;
                                                    if (iVar8 < 2) {
                                                      iVar8 = 1;
                                                    }
                                                    do {
                                                      emitter_printf(peVar19,"%s",pcVar25);
                                                      iVar8 = iVar8 + -1;
                                                    } while (iVar8 != 0);
                                                  }
                                                  }
                                                  emitter_printf(peVar19,"]");
                                                  }
                                                  if (peVar19->output < emitter_output_table) {
                                                    peVar19->nesting_depth =
                                                         peVar19->nesting_depth + -1;
                                                    peVar19->item_at_depth = true;
                                                    if (peVar19->output !=
                                                        emitter_output_json_compact) {
                                                      emitter_printf(peVar19,anon_var_dwarf_63fc88c
                                                                             + 8);
                                                      if (peVar19->output != emitter_output_json) {
                                                        pcVar21 = " ";
                                                      }
                                                      if (0 < peVar19->nesting_depth) {
                                                        iVar9 = peVar19->nesting_depth <<
                                                                (peVar19->output !=
                                                                emitter_output_json);
                                                        iVar8 = 1;
                                                        if (1 < iVar9) {
                                                          iVar8 = iVar9;
                                                        }
                                                        do {
                                                          emitter_printf(peVar19,"%s",pcVar21);
                                                          iVar8 = iVar8 + -1;
                                                        } while (iVar8 != 0);
                                                      }
                                                    }
                                                    emitter_printf(peVar19,"}");
                                                  }
                                                  if (bVar18 == 0) {
                                                    return;
                                                  }
                                                  emitter_table_printf
                                                            (peVar19,"                     ---\n");
                                                  return;
                                                  }
                                                  }
LAB_00d076db:
                                                  pcVar21 = 
                                                  "<jemalloc>: Failure in ctl_bymibname()\n";
                                                  goto LAB_00d076e2;
                                                  }
                                                  }
                                                  goto LAB_00d076f5;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pcVar21 = "<jemalloc>: Failure in xmallctlbymib()\n";
LAB_00d076e2:
  duckdb_je_malloc_write(pcVar21);
  abort();
}

Assistant:

JEMALLOC_COLD
static void
stats_arena_print(emitter_t *emitter, unsigned i, bool bins, bool large,
    bool mutex, bool extents, bool hpa) {
	char name[ARENA_NAME_LEN];
	char *namep = name;
	unsigned nthreads;
	const char *dss;
	ssize_t dirty_decay_ms, muzzy_decay_ms;
	size_t page, pactive, pdirty, pmuzzy, mapped, retained;
	size_t base, internal, resident, metadata_edata, metadata_rtree,
	    metadata_thp, extent_avail;
	uint64_t dirty_npurge, dirty_nmadvise, dirty_purged;
	uint64_t muzzy_npurge, muzzy_nmadvise, muzzy_purged;
	size_t small_allocated;
	uint64_t small_nmalloc, small_ndalloc, small_nrequests, small_nfills,
	    small_nflushes;
	size_t large_allocated;
	uint64_t large_nmalloc, large_ndalloc, large_nrequests, large_nfills,
	    large_nflushes;
	size_t tcache_bytes, tcache_stashed_bytes, abandoned_vm;
	uint64_t uptime;

	CTL_GET("arenas.page", &page, size_t);
	if (i != MALLCTL_ARENAS_ALL && i != MALLCTL_ARENAS_DESTROYED) {
		CTL_M1_GET("arena.0.name", i, (void *)&namep, const char *);
		emitter_kv(emitter, "name", "name", emitter_type_string, &namep);
	}

	CTL_M2_GET("stats.arenas.0.nthreads", i, &nthreads, unsigned);
	emitter_kv(emitter, "nthreads", "assigned threads",
	    emitter_type_unsigned, &nthreads);

	CTL_M2_GET("stats.arenas.0.uptime", i, &uptime, uint64_t);
	emitter_kv(emitter, "uptime_ns", "uptime", emitter_type_uint64,
	    &uptime);

	CTL_M2_GET("stats.arenas.0.dss", i, &dss, const char *);
	emitter_kv(emitter, "dss", "dss allocation precedence",
	    emitter_type_string, &dss);

	CTL_M2_GET("stats.arenas.0.dirty_decay_ms", i, &dirty_decay_ms,
	    ssize_t);
	CTL_M2_GET("stats.arenas.0.muzzy_decay_ms", i, &muzzy_decay_ms,
	    ssize_t);
	CTL_M2_GET("stats.arenas.0.pactive", i, &pactive, size_t);
	CTL_M2_GET("stats.arenas.0.pdirty", i, &pdirty, size_t);
	CTL_M2_GET("stats.arenas.0.pmuzzy", i, &pmuzzy, size_t);
	CTL_M2_GET("stats.arenas.0.dirty_npurge", i, &dirty_npurge, uint64_t);
	CTL_M2_GET("stats.arenas.0.dirty_nmadvise", i, &dirty_nmadvise,
	    uint64_t);
	CTL_M2_GET("stats.arenas.0.dirty_purged", i, &dirty_purged, uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_npurge", i, &muzzy_npurge, uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_nmadvise", i, &muzzy_nmadvise,
	    uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_purged", i, &muzzy_purged, uint64_t);

	emitter_row_t decay_row;
	emitter_row_init(&decay_row);

	/* JSON-style emission. */
	emitter_json_kv(emitter, "dirty_decay_ms", emitter_type_ssize,
	    &dirty_decay_ms);
	emitter_json_kv(emitter, "muzzy_decay_ms", emitter_type_ssize,
	    &muzzy_decay_ms);

	emitter_json_kv(emitter, "pactive", emitter_type_size, &pactive);
	emitter_json_kv(emitter, "pdirty", emitter_type_size, &pdirty);
	emitter_json_kv(emitter, "pmuzzy", emitter_type_size, &pmuzzy);

	emitter_json_kv(emitter, "dirty_npurge", emitter_type_uint64,
	    &dirty_npurge);
	emitter_json_kv(emitter, "dirty_nmadvise", emitter_type_uint64,
	    &dirty_nmadvise);
	emitter_json_kv(emitter, "dirty_purged", emitter_type_uint64,
	    &dirty_purged);

	emitter_json_kv(emitter, "muzzy_npurge", emitter_type_uint64,
	    &muzzy_npurge);
	emitter_json_kv(emitter, "muzzy_nmadvise", emitter_type_uint64,
	    &muzzy_nmadvise);
	emitter_json_kv(emitter, "muzzy_purged", emitter_type_uint64,
	    &muzzy_purged);

	/* Table-style emission. */
	COL(decay_row, decay_type, right, 9, title);
	col_decay_type.str_val = "decaying:";

	COL(decay_row, decay_time, right, 6, title);
	col_decay_time.str_val = "time";

	COL(decay_row, decay_npages, right, 13, title);
	col_decay_npages.str_val = "npages";

	COL(decay_row, decay_sweeps, right, 13, title);
	col_decay_sweeps.str_val = "sweeps";

	COL(decay_row, decay_madvises, right, 13, title);
	col_decay_madvises.str_val = "madvises";

	COL(decay_row, decay_purged, right, 13, title);
	col_decay_purged.str_val = "purged";

	/* Title row. */
	emitter_table_row(emitter, &decay_row);

	/* Dirty row. */
	col_decay_type.str_val = "dirty:";

	if (dirty_decay_ms >= 0) {
		col_decay_time.type = emitter_type_ssize;
		col_decay_time.ssize_val = dirty_decay_ms;
	} else {
		col_decay_time.type = emitter_type_title;
		col_decay_time.str_val = "N/A";
	}

	col_decay_npages.type = emitter_type_size;
	col_decay_npages.size_val = pdirty;

	col_decay_sweeps.type = emitter_type_uint64;
	col_decay_sweeps.uint64_val = dirty_npurge;

	col_decay_madvises.type = emitter_type_uint64;
	col_decay_madvises.uint64_val = dirty_nmadvise;

	col_decay_purged.type = emitter_type_uint64;
	col_decay_purged.uint64_val = dirty_purged;

	emitter_table_row(emitter, &decay_row);

	/* Muzzy row. */
	col_decay_type.str_val = "muzzy:";

	if (muzzy_decay_ms >= 0) {
		col_decay_time.type = emitter_type_ssize;
		col_decay_time.ssize_val = muzzy_decay_ms;
	} else {
		col_decay_time.type = emitter_type_title;
		col_decay_time.str_val = "N/A";
	}

	col_decay_npages.type = emitter_type_size;
	col_decay_npages.size_val = pmuzzy;

	col_decay_sweeps.type = emitter_type_uint64;
	col_decay_sweeps.uint64_val = muzzy_npurge;

	col_decay_madvises.type = emitter_type_uint64;
	col_decay_madvises.uint64_val = muzzy_nmadvise;

	col_decay_purged.type = emitter_type_uint64;
	col_decay_purged.uint64_val = muzzy_purged;

	emitter_table_row(emitter, &decay_row);

	/* Small / large / total allocation counts. */
	emitter_row_t alloc_count_row;
	emitter_row_init(&alloc_count_row);

	COL(alloc_count_row, count_title, left, 21, title);
	col_count_title.str_val = "";

	COL(alloc_count_row, count_allocated, right, 16, title);
	col_count_allocated.str_val = "allocated";

	COL(alloc_count_row, count_nmalloc, right, 16, title);
	col_count_nmalloc.str_val = "nmalloc";
	COL(alloc_count_row, count_nmalloc_ps, right, 10, title);
	col_count_nmalloc_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_ndalloc, right, 16, title);
	col_count_ndalloc.str_val = "ndalloc";
	COL(alloc_count_row, count_ndalloc_ps, right, 10, title);
	col_count_ndalloc_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nrequests, right, 16, title);
	col_count_nrequests.str_val = "nrequests";
	COL(alloc_count_row, count_nrequests_ps, right, 10, title);
	col_count_nrequests_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nfills, right, 16, title);
	col_count_nfills.str_val = "nfill";
	COL(alloc_count_row, count_nfills_ps, right, 10, title);
	col_count_nfills_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nflushes, right, 16, title);
	col_count_nflushes.str_val = "nflush";
	COL(alloc_count_row, count_nflushes_ps, right, 10, title);
	col_count_nflushes_ps.str_val = "(#/sec)";

	emitter_table_row(emitter, &alloc_count_row);

	col_count_nmalloc_ps.type = emitter_type_uint64;
	col_count_ndalloc_ps.type = emitter_type_uint64;
	col_count_nrequests_ps.type = emitter_type_uint64;
	col_count_nfills_ps.type = emitter_type_uint64;
	col_count_nflushes_ps.type = emitter_type_uint64;

#define GET_AND_EMIT_ALLOC_STAT(small_or_large, name, valtype)		\
	CTL_M2_GET("stats.arenas.0." #small_or_large "." #name, i,	\
	    &small_or_large##_##name, valtype##_t);			\
	emitter_json_kv(emitter, #name, emitter_type_##valtype,		\
	    &small_or_large##_##name);					\
	col_count_##name.type = emitter_type_##valtype;		\
	col_count_##name.valtype##_val = small_or_large##_##name;

	emitter_json_object_kv_begin(emitter, "small");
	col_count_title.str_val = "small:";

	GET_AND_EMIT_ALLOC_STAT(small, allocated, size)
	GET_AND_EMIT_ALLOC_STAT(small, nmalloc, uint64)
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, ndalloc, uint64)
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nrequests, uint64)
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nfills, uint64)
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nflushes, uint64)
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);

	emitter_table_row(emitter, &alloc_count_row);
	emitter_json_object_end(emitter); /* Close "small". */

	emitter_json_object_kv_begin(emitter, "large");
	col_count_title.str_val = "large:";

	GET_AND_EMIT_ALLOC_STAT(large, allocated, size)
	GET_AND_EMIT_ALLOC_STAT(large, nmalloc, uint64)
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, ndalloc, uint64)
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nrequests, uint64)
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nfills, uint64)
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nflushes, uint64)
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);

	emitter_table_row(emitter, &alloc_count_row);
	emitter_json_object_end(emitter); /* Close "large". */

#undef GET_AND_EMIT_ALLOC_STAT

	/* Aggregated small + large stats are emitter only in table mode. */
	col_count_title.str_val = "total:";
	col_count_allocated.size_val = small_allocated + large_allocated;
	col_count_nmalloc.uint64_val = small_nmalloc + large_nmalloc;
	col_count_ndalloc.uint64_val = small_ndalloc + large_ndalloc;
	col_count_nrequests.uint64_val = small_nrequests + large_nrequests;
	col_count_nfills.uint64_val = small_nfills + large_nfills;
	col_count_nflushes.uint64_val = small_nflushes + large_nflushes;
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);
	emitter_table_row(emitter, &alloc_count_row);

	emitter_row_t mem_count_row;
	emitter_row_init(&mem_count_row);

	emitter_col_t mem_count_title;
	emitter_col_init(&mem_count_title, &mem_count_row);
	mem_count_title.justify = emitter_justify_left;
	mem_count_title.width = 21;
	mem_count_title.type = emitter_type_title;
	mem_count_title.str_val = "";

	emitter_col_t mem_count_val;
	emitter_col_init(&mem_count_val, &mem_count_row);
	mem_count_val.justify = emitter_justify_right;
	mem_count_val.width = 16;
	mem_count_val.type = emitter_type_title;
	mem_count_val.str_val = "";

	emitter_table_row(emitter, &mem_count_row);
	mem_count_val.type = emitter_type_size;

	/* Active count in bytes is emitted only in table mode. */
	mem_count_title.str_val = "active:";
	mem_count_val.size_val = pactive * page;
	emitter_table_row(emitter, &mem_count_row);

#define GET_AND_EMIT_MEM_STAT(stat)					\
	CTL_M2_GET("stats.arenas.0."#stat, i, &stat, size_t);		\
	emitter_json_kv(emitter, #stat, emitter_type_size, &stat);	\
	mem_count_title.str_val = #stat":";				\
	mem_count_val.size_val = stat;					\
	emitter_table_row(emitter, &mem_count_row);

	GET_AND_EMIT_MEM_STAT(mapped)
	GET_AND_EMIT_MEM_STAT(retained)
	GET_AND_EMIT_MEM_STAT(base)
	GET_AND_EMIT_MEM_STAT(internal)
	GET_AND_EMIT_MEM_STAT(metadata_edata)
	GET_AND_EMIT_MEM_STAT(metadata_rtree)
	GET_AND_EMIT_MEM_STAT(metadata_thp)
	GET_AND_EMIT_MEM_STAT(tcache_bytes)
	GET_AND_EMIT_MEM_STAT(tcache_stashed_bytes)
	GET_AND_EMIT_MEM_STAT(resident)
	GET_AND_EMIT_MEM_STAT(abandoned_vm)
	GET_AND_EMIT_MEM_STAT(extent_avail)
#undef GET_AND_EMIT_MEM_STAT

	if (mutex) {
		stats_arena_mutexes_print(emitter, i, uptime);
	}
	if (bins) {
		stats_arena_bins_print(emitter, mutex, i, uptime);
	}
	if (large) {
		stats_arena_lextents_print(emitter, i, uptime);
	}
	if (extents) {
		stats_arena_extents_print(emitter, i);
	}
	if (hpa) {
		stats_arena_hpa_shard_print(emitter, i, uptime);
	}
}